

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake.cpp
# Opt level: O1

int __thiscall UnixMakefileGenerator::init(UnixMakefileGenerator *this,EVP_PKEY_CTX *ctx)

{
  Data *pDVar1;
  ProString *pPVar2;
  QMakeEvaluator *pQVar3;
  byte bVar4;
  QString file;
  QString string;
  bool bVar5;
  QMakeEvaluator *pQVar6;
  QHash<ProKey,_ProFunctionDef> QVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  char cVar11;
  char cVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  QList<ProString> *pQVar16;
  QArrayDataPointer<ProString> *pQVar17;
  QArrayDataPointer<ProString> *pQVar18;
  QList<ProString> *pQVar19;
  pointer pQVar20;
  iterator iVar21;
  iterator iVar22;
  char16_t *pcVar23;
  qsizetype qVar24;
  ProStringList *pPVar25;
  ProStringList *pPVar26;
  ProStringList *value;
  QMovableArrayOps<ProString> *this_00;
  qsizetype *pqVar27;
  QMakeEvaluator *pQVar28;
  undefined8 uVar29;
  QMakeEvaluator *pQVar30;
  QMakeProject *pQVar31;
  long lVar32;
  char *pcVar33;
  EVP_PKEY_CTX *ctx_00;
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  QVar34;
  undefined1 auVar35 [8];
  ProString *arch;
  QMakeEvaluator *pQVar36;
  ProString *iif;
  undefined1 auVar37 [8];
  ulong uVar38;
  long in_FS_OFFSET;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QByteArrayView QVar49;
  QByteArrayView QVar50;
  QByteArrayView QVar51;
  QAnyStringView QVar52;
  QLatin1String QVar53;
  QLatin1String QVar54;
  QByteArrayView QVar55;
  QLatin1String QVar56;
  QLatin1String QVar57;
  QByteArrayView QVar58;
  QLatin1String QVar59;
  QLatin1String QVar60;
  QByteArrayView QVar61;
  QLatin1String QVar62;
  QLatin1String QVar63;
  QAnyStringView QVar64;
  QAnyStringView QVar65;
  QByteArrayView QVar66;
  QByteArrayView QVar67;
  QByteArrayView QVar68;
  QByteArrayView QVar69;
  QByteArrayView QVar70;
  QByteArrayView QVar71;
  QByteArrayView QVar72;
  QByteArrayView QVar73;
  QStringView config;
  QStringView config_00;
  QStringView config_01;
  QStringView config_02;
  QStringView config_03;
  QStringView config_04;
  QStringView config_05;
  QStringView config_06;
  QStringView config_07;
  QStringView config_08;
  QStringView config_09;
  QStringView config_10;
  QStringView config_11;
  QStringView config_12;
  QStringView config_13;
  QLatin1String other;
  QStringView config_14;
  QStringView config_15;
  QStringView config_16;
  QStringView config_17;
  QStringView config_18;
  QStringView config_19;
  ProString bundle;
  ProKey runCompImp;
  ProKey runComp;
  ProStringList ret;
  ProStringList ret_1;
  ProString target;
  UnixMakefileGenerator *pUVar74;
  UnixMakefileGenerator *pUVar75;
  QMakeEvaluator *local_440;
  ProKey local_438;
  ProString local_408;
  undefined1 local_3d8 [8];
  QMakeEvaluator *pQStack_3d0;
  QMakeEvaluator *pQStack_3c8;
  ProKey local_3a8;
  undefined1 local_378 [8];
  QMakeEvaluator *pQStack_370;
  QMakeEvaluator *local_368;
  undefined1 local_348 [8];
  QMakeEvaluator *pQStack_340;
  QMakeEvaluator *local_338;
  undefined8 uStack_330;
  ProValueMap local_328;
  QMakeEvaluator *pQStack_320;
  undefined1 local_318 [8];
  QMakeEvaluator *pQStack_310;
  QMakeEvaluator *local_308;
  char16_t *pcStack_300;
  ProValueMap local_2f8;
  Location *pLStack_2f0;
  undefined1 local_2e8 [8];
  QMakeEvaluator *pQStack_2e0;
  QMakeEvaluator *local_2d8;
  char16_t *pcStack_2d0;
  ProValueMap local_2c8;
  Location *pLStack_2c0;
  ProString local_2b0;
  EVP_PKEY_CTX local_280 [24];
  QMakeEvaluator *local_268;
  QMakeEvaluator *local_260;
  QMakeEvaluator *pQStack_258;
  undefined1 local_250 [16];
  QMakeParser *pQStack_240;
  QExplicitlySharedDataPointer<QMakeFeatureRoots> local_238;
  QArrayDataPointer<ProString> local_228;
  QString local_208;
  QArrayDataPointer<QString> local_1e8;
  ProKey local_1c8;
  QString local_198;
  undefined1 local_178 [16];
  QHash<ProKey,_ProFunctionDef> local_168;
  ProString local_148;
  ProString local_118;
  ProKey local_e8;
  undefined1 local_b8 [8];
  QMakeEvaluator *pQStack_b0;
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  local_a8;
  QMakeEvaluator *pQStack_a0;
  QMakeEvaluator *pQStack_98;
  QMakeEvaluator *local_90;
  QMakeEvaluator *local_88;
  undefined1 local_78 [8];
  undefined1 auStack_70 [32];
  QMakeEvaluator *pQStack_50;
  QMakeEvaluator *local_48;
  QMakeVfs *local_40;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  pQVar30 = (QMakeEvaluator *)&(this->super_MakefileGenerator).project;
  pQVar31 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_78,"CONFIG");
  pQVar16 = &QMakeEvaluator::valuesRef(&pQVar31->super_QMakeEvaluator,(ProKey *)local_78)->
             super_QList<ProString>;
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar31 = *(QMakeProject **)pQVar30;
  ProKey::ProKey((ProKey *)local_78,"ICON");
  bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
  if (bVar8) {
    pQVar31 = *(QMakeProject **)pQVar30;
    ProKey::ProKey(&local_e8,"RC_FILE");
    bVar8 = QMakeProject::isEmpty(pQVar31,&local_e8);
    bVar8 = !bVar8;
    auVar35 = (undefined1  [8])pQVar30;
    if ((QMakeGlobals *)local_e8.super_ProString.m_string.d.d != (QMakeGlobals *)0x0) {
      LOCK();
      *(int *)local_e8.super_ProString.m_string.d.d =
           *(int *)local_e8.super_ProString.m_string.d.d + -1;
      UNLOCK();
      if (*(int *)local_e8.super_ProString.m_string.d.d == 0) {
        QArrayData::deallocate(&(local_e8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    bVar8 = false;
    auVar35 = (undefined1  [8])pQVar30;
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  if (bVar8) {
    pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
    ProKey::ProKey((ProKey *)local_78,"RC_FILE");
    pQVar17 = (QArrayDataPointer<ProString> *)QMakeEvaluator::valuesRef(pQVar28,(ProKey *)local_78);
    pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
    ProKey::ProKey((ProKey *)local_b8,"ICON");
    pQVar18 = (QArrayDataPointer<ProString> *)QMakeEvaluator::valuesRef(pQVar28,(ProKey *)local_b8);
    QArrayDataPointer<ProString>::operator=(pQVar18,pQVar17);
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_b8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_b8)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_b8)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_78)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
  }
  pQVar31 = (QMakeProject *)(((QString *)&pQVar30->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_EXTENSION_PLUGIN");
  bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  if (bVar8) {
    pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_EXTENSION_PLUGIN");
    pQVar19 = &QMakeEvaluator::valuesRef(pQVar28,(ProKey *)local_78)->super_QList<ProString>;
    pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
    ProKey::ProKey((ProKey *)&local_118,"QMAKE_EXTENSION_SHLIB");
    QMakeEvaluator::first((ProString *)local_b8,pQVar28,(ProKey *)&local_118);
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)pQVar19,(pQVar19->d).size,(ProString *)local_b8);
    QList<ProString>::end(pQVar19);
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_b8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_b8)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_b8)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    if ((ProString *)local_118.m_string.d.d != (ProString *)0x0) {
      LOCK();
      ((__atomic_base<int> *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d)->_M_i
           = ((__atomic_base<int> *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d
             )->_M_i + -1;
      UNLOCK();
      if (((__atomic_base<int> *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d)->
          _M_i == 0) {
        QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_78)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
  }
  pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_78,"TARGET");
  pQVar17 = (QArrayDataPointer<ProString> *)QMakeEvaluator::valuesRef(pQVar28,(ProKey *)local_78);
  pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_b8,"QMAKE_ORIG_TARGET");
  pQVar18 = (QArrayDataPointer<ProString> *)QMakeEvaluator::valuesRef(pQVar28,(ProKey *)local_b8);
  QArrayDataPointer<ProString>::operator=(pQVar18,pQVar17);
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar31 = (QMakeProject *)(((QString *)&pQVar30->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_78,"VERSION");
  bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  if (bVar8) {
    pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
    ProKey::ProKey((ProKey *)local_b8,"VERSION");
    pQVar19 = &QMakeEvaluator::valuesRef(pQVar28,(ProKey *)local_b8)->super_QList<ProString>;
    pQVar31 = (QMakeProject *)(((QString *)&pQVar30->m_caller)->d).d;
    ProKey::ProKey((ProKey *)local_178,"VER_PAT");
    bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_178);
    if (bVar8) {
      QVar39.m_data = (storage_type *)0x1;
      QVar39.m_size = (qsizetype)local_78;
      QString::fromUtf8(QVar39);
      local_198.d.d = (Data *)local_78;
      local_198.d.ptr = (char16_t *)auStack_70._0_8_;
      local_198.d.size = auStack_70._8_8_;
      ProString::ProString(&local_148,&local_198);
    }
    else {
      pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
      ProKey::ProKey(&local_1c8,"VER_PAT");
      QMakeEvaluator::first(&local_148,pQVar28,&local_1c8);
    }
    local_78 = (undefined1  [8])anon_var_dwarf_2c2e3d;
    ProString::ProString((ProString *)auStack_70,&local_148);
    ProString::ProString<char_const(&)[5],ProString>
              (&local_118,(QStringBuilder<const_char_(&)[5],_ProString> *)local_78);
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)pQVar19,(pQVar19->d).size,&local_118);
    QList<ProString>::end(pQVar19);
    if ((ProString *)local_118.m_string.d.d != (ProString *)0x0) {
      LOCK();
      ((__atomic_base<int> *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d)->_M_i
           = ((__atomic_base<int> *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d
             )->_M_i + -1;
      UNLOCK();
      if (((__atomic_base<int> *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d)->
          _M_i == 0) {
        QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QMakeEvaluator *)auStack_70._0_8_ != (QMakeEvaluator *)0x0) {
      LOCK();
      *(int *)&(((QString *)auStack_70._0_8_)->d).d =
           *(int *)&(((QString *)auStack_70._0_8_)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)auStack_70._0_8_)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)auStack_70._0_8_,2,0x10);
      }
    }
    if ((QMakeFeatureRoots *)local_148.m_string.d.d != (QMakeFeatureRoots *)0x0) {
      LOCK();
      *(int *)local_148.m_string.d.d = *(int *)local_148.m_string.d.d + -1;
      UNLOCK();
      if (*(int *)local_148.m_string.d.d == 0) {
        QArrayData::deallocate(&(local_148.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar8) {
      if ((QMakeEvaluator *)local_198.d.d != (QMakeEvaluator *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_198.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_198.d.d)->super_QArrayData)->d).d + -1;
        iVar15 = *(int *)&(((QString *)&(local_198.d.d)->super_QArrayData)->d).d;
        UNLOCK();
        local_1c8.super_ProString.m_string.d.d = local_198.d.d;
joined_r0x001a69b0:
        if (iVar15 == 0) {
          QArrayData::deallocate(&(local_1c8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
    }
    else if ((QMakeEvaluator *)local_1c8.super_ProString.m_string.d.d != (QMakeEvaluator *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_1c8.super_ProString.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_1c8.super_ProString.m_string.d.d)->super_QArrayData)->d).d
           + -1;
      iVar15 = *(int *)&(((QString *)&(local_1c8.super_ProString.m_string.d.d)->super_QArrayData)->d
                        ).d;
      UNLOCK();
      goto joined_r0x001a69b0;
    }
    if ((QMakeFeatureRoots *)local_178._0_8_ != (QMakeFeatureRoots *)0x0) {
      LOCK();
      *(int *)local_178._0_8_ = *(int *)local_178._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_178._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_178._0_8_,2,0x10);
      }
    }
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_b8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_b8)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_b8)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
  }
  local_1e8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_1e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_1e8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_b8,"VERSION");
  QMakeEvaluator::first((ProString *)local_78,pQVar28,(ProKey *)local_b8);
  ProString::toQString(&local_118.m_string,(ProString *)local_78);
  QString::split(&local_1e8,&local_118,0x2e,0,1);
  if ((ProString *)local_118.m_string.d.d != (ProString *)0x0) {
    LOCK();
    ((__atomic_base<int> *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d)->_M_i =
         ((__atomic_base<int> *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d)->
         _M_i + -1;
    UNLOCK();
    if (((__atomic_base<int> *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d)->
        _M_i == 0) {
      QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  QVar40.m_data = (storage_type *)0x1;
  QVar40.m_size = (qsizetype)local_78;
  QString::fromUtf8(QVar40);
  local_b8 = local_78;
  pQStack_b0 = (QMakeEvaluator *)auStack_70._0_8_;
  local_a8.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
        )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
          )auStack_70._8_8_;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_1e8,local_1e8.size,(QString *)local_b8);
  QList<QString>::end((QList<QString> *)&local_1e8);
  QVar41.m_data = (storage_type *)0x1;
  QVar41.m_size = (qsizetype)local_78;
  QString::fromUtf8(QVar41);
  local_118.m_string.d.d = (Data *)local_78;
  local_118.m_string.d.ptr = (char16_t *)auStack_70._0_8_;
  local_118.m_string.d.size = auStack_70._8_8_;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_1e8,local_1e8.size,&local_118.m_string);
  QList<QString>::end((QList<QString> *)&local_1e8);
  if ((QMakeEvaluator *)local_118.m_string.d.d != (QMakeEvaluator *)0x0) {
    LOCK();
    *(int *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d =
         *(int *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d == 0) {
      QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_b8)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_78,"VER_MAJ");
  pQVar19 = &QMakeEvaluator::valuesRef(pQVar28,(ProKey *)local_78)->super_QList<ProString>;
  pQVar20 = QList<QString>::data((QList<QString> *)&local_1e8);
  ProString::ProString((ProString *)local_b8,pQVar20);
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
            ((QMovableArrayOps<ProString> *)pQVar19,(pQVar19->d).size,(ProString *)local_b8);
  QList<ProString>::end(pQVar19);
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_b8)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_78,"VER_MIN");
  pQVar19 = &QMakeEvaluator::valuesRef(pQVar28,(ProKey *)local_78)->super_QList<ProString>;
  pQVar20 = QList<QString>::data((QList<QString> *)&local_1e8);
  ProString::ProString((ProString *)local_b8,pQVar20 + 1);
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
            ((QMovableArrayOps<ProString> *)pQVar19,(pQVar19->d).size,(ProString *)local_b8);
  QList<ProString>::end(pQVar19);
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_b8)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_78,"VER_PAT");
  pQVar19 = &QMakeEvaluator::valuesRef(pQVar28,(ProKey *)local_78)->super_QList<ProString>;
  pQVar20 = QList<QString>::data((QList<QString> *)&local_1e8);
  ProString::ProString((ProString *)local_b8,pQVar20 + 2);
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
            ((QMovableArrayOps<ProString> *)pQVar19,(pQVar19->d).size,(ProString *)local_b8);
  QList<ProString>::end(pQVar19);
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_b8)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pDVar1 = (((QString *)&pQVar30->m_caller)->d).d;
  pqVar27 = &pDVar1[0x12].super_QArrayData.alloc;
  if (pDVar1[0x13].super_QArrayData.alloc == 0) {
    pqVar27 = (qsizetype *)(pDVar1 + 0x14);
  }
  local_208.d.d = (Data *)*pqVar27;
  local_208.d.ptr = (char16_t *)pqVar27[1];
  local_208.d.size = pqVar27[2];
  if ((QArrayData *)local_208.d.d != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)local_208.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)local_208.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_INTERNAL_INCLUDED_FILES");
  pQVar19 = &QMakeEvaluator::valuesRef(pQVar30,(ProKey *)local_78)->super_QList<ProString>;
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  iVar21 = QList<ProString>::begin(pQVar19);
  iVar22 = QList<ProString>::end(pQVar19);
  if (iVar21.i != iVar22.i) {
    do {
      pDVar1 = (((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d;
      local_78 = (undefined1  [8])pDVar1[0xf].super_QArrayData.alloc;
      auStack_70._0_8_ = *(undefined8 *)&pDVar1[0x10].super_QArrayData;
      auStack_70._8_8_ = pDVar1[0x10].super_QArrayData.alloc;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)&((QMakeEvaluator *)local_78)->m_caller)->d).d =
             *(int *)&(((QString *)&((QMakeEvaluator *)local_78)->m_caller)->d).d + 1;
        UNLOCK();
      }
      bVar8 = ProString::operator==(iVar21.i,(QString *)local_78);
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_78)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      if ((!bVar8) && (bVar8 = ProString::startsWith(iVar21.i,&local_208,CaseSensitive), bVar8)) {
        pcVar23 = ((iVar21.i)->m_string).d.ptr;
        if (pcVar23 == (char16_t *)0x0) {
          pcVar23 = (char16_t *)&QString::_empty;
        }
        if (pcVar23[(long)(iVar21.i)->m_offset + (long)(int)local_208.d.size] == L'/') {
          ProString::toQString(&local_148.m_string,iVar21.i);
          pUVar74 = this;
          MakefileGenerator::fileFixify
                    (&local_118.m_string,&this->super_MakefileGenerator,&local_148.m_string,
                     (FileFixifyTypes)0x8,true);
          ProString::ProString((ProString *)local_78,&local_118.m_string);
          pQVar31 = (this->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)local_b8,"DISTFILES");
          pQVar19 = &QMakeEvaluator::valuesRef(&pQVar31->super_QMakeEvaluator,(ProKey *)local_b8)->
                     super_QList<ProString>;
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar19,(pQVar19->d).size,(ProString *)local_78)
          ;
          QList<ProString>::end(pQVar19);
          this = pUVar74;
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_b8)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
              this = pUVar74;
            }
          }
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_78)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          if ((QMakeEvaluator *)local_118.m_string.d.d != (QMakeEvaluator *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((QMakeFeatureRoots *)local_148.m_string.d.d != (QMakeFeatureRoots *)0x0) {
            LOCK();
            *(int *)local_148.m_string.d.d = *(int *)local_148.m_string.d.d + -1;
            UNLOCK();
            if (*(int *)local_148.m_string.d.d == 0) {
              QArrayData::deallocate(&(local_148.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      iVar21.i = iVar21.i + 1;
    } while (iVar21.i != iVar22.i);
  }
  pQVar30 = (QMakeEvaluator *)(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d;
  pQVar28 = (QMakeEvaluator *)auVar35;
  ProKey::ProKey((ProKey *)local_b8,"TEMPLATE");
  QMakeEvaluator::first((ProString *)local_78,pQVar30,(ProKey *)local_b8);
  bVar8 = ProString::operator==((ProString *)local_78,"app");
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_b8)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (bVar8) {
    pQVar30 = (QMakeEvaluator *)(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d;
    pcVar33 = "QMAKE_APP_FLAG";
LAB_001a7227:
    ProKey::ProKey((ProKey *)local_78,pcVar33);
    pQVar19 = &QMakeEvaluator::valuesRef(pQVar30,(ProKey *)local_78)->super_QList<ProString>;
    ProString::ProString((ProString *)local_b8,"1");
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)pQVar19,(pQVar19->d).size,(ProString *)local_b8);
    QList<ProString>::end(pQVar19);
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_b8)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_78)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
  }
  else {
    pQVar30 = (QMakeEvaluator *)(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d;
    ProKey::ProKey((ProKey *)local_b8,"TEMPLATE");
    QMakeEvaluator::first((ProString *)local_78,pQVar30,(ProKey *)local_b8);
    bVar8 = ProString::operator==((ProString *)local_78,"lib");
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_78)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_b8)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    if (bVar8) {
      pQVar30 = (QMakeEvaluator *)(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d;
      pcVar33 = "QMAKE_LIB_FLAG";
      goto LAB_001a7227;
    }
    pQVar30 = (QMakeEvaluator *)(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d;
    ProKey::ProKey((ProKey *)local_b8,"TEMPLATE");
    QMakeEvaluator::first((ProString *)local_78,pQVar30,(ProKey *)local_b8);
    ctx_00 = (EVP_PKEY_CTX *)0x2b024a;
    bVar8 = ProString::operator==((ProString *)local_78,"subdirs");
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_78)->d).d == 0) {
        ctx_00 = (EVP_PKEY_CTX *)0x2;
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_b8)->d).d == 0) {
        ctx_00 = (EVP_PKEY_CTX *)0x2;
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    if (bVar8) {
      MakefileGenerator::init(&this->super_MakefileGenerator,ctx_00);
      pQVar31 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_78,"MAKEFILE");
      bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_78)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      if (bVar8) {
        pQVar30 = (QMakeEvaluator *)(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d;
        ProKey::ProKey((ProKey *)local_78,"MAKEFILE");
        pQVar16 = &QMakeEvaluator::valuesRef(pQVar30,(ProKey *)local_78)->super_QList<ProString>;
        ProString::ProString((ProString *)local_b8,"Makefile");
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                  ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)local_b8);
        QList<ProString>::end(pQVar16);
        if (local_b8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_b8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
          }
        }
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_78)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
      }
      goto LAB_001ac226;
    }
  }
  pQVar30 = (QMakeEvaluator *)(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_78,"DESTDIR");
  pQVar17 = (QArrayDataPointer<ProString> *)QMakeEvaluator::valuesRef(pQVar30,(ProKey *)local_78);
  pQVar30 = (QMakeEvaluator *)(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_b8,"QMAKE_ORIG_DESTDIR");
  pQVar18 = (QArrayDataPointer<ProString> *)QMakeEvaluator::valuesRef(pQVar30,(ProKey *)local_b8);
  QArrayDataPointer<ProString>::operator=(pQVar18,pQVar17);
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_b8)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar31 = (QMakeProject *)(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_LIB_FLAG");
  bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
  pQVar30 = (QMakeEvaluator *)auVar35;
  if (bVar8) {
LAB_001a7595:
    pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
    auVar35 = (undefined1  [8])local_b8;
    QVar43.m_data = (storage_type *)0x2;
    QVar43.m_size = (qsizetype)auVar35;
    QString::fromUtf8(QVar43);
    auVar37 = local_b8;
    bVar9 = false;
    config_00.m_data = (storage_type_conflict *)pQStack_b0;
    config_00.m_size = (qsizetype)local_a8.d.ptr;
    bVar10 = QMakeEvaluator::isActiveConfig(pQVar36,config_00,false);
    if (bVar10) {
      pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
      QVar44.m_data = (storage_type *)0x6;
      QVar44.m_size = (qsizetype)local_b8;
      QString::fromUtf8(QVar44);
      auVar35 = local_b8;
      bVar9 = false;
      config_01.m_data = (storage_type_conflict *)pQStack_b0;
      config_01.m_size = (qsizetype)local_a8.d.ptr;
      bVar10 = QMakeEvaluator::isActiveConfig(pQVar30,config_01,false);
      bVar4 = 0;
      pQVar30 = pQVar28;
    }
    else {
      bVar4 = 1;
      bVar10 = false;
      pQVar30 = pQVar28;
    }
  }
  else {
    auVar37 = (undefined1  [8])(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d;
    QVar42.m_data = (storage_type *)0x9;
    QVar42.m_size = (qsizetype)local_b8;
    QString::fromUtf8(QVar42);
    local_440 = (QMakeEvaluator *)local_b8;
    config.m_data = (storage_type_conflict *)pQStack_b0;
    config.m_size = (qsizetype)local_a8.d.ptr;
    pQVar30 = pQVar28;
    bVar9 = QMakeEvaluator::isActiveConfig((QMakeEvaluator *)auVar37,config,false);
    pQVar28 = pQVar30;
    if (bVar9) goto LAB_001a7595;
    bVar9 = true;
    bVar4 = 1;
    bVar8 = false;
    bVar10 = true;
  }
  if (!(bool)(auVar35 == (undefined1  [8])0x0 | bVar4)) {
    LOCK();
    *(int *)&(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d =
         *(int *)&(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)auVar35,2,0x10);
    }
  }
  if (!bVar9 && auVar37 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)&((QMakeEvaluator *)auVar37)->m_caller)->d).d =
         *(int *)&(((QString *)&((QMakeEvaluator *)auVar37)->m_caller)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&((QMakeEvaluator *)auVar37)->m_caller)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)auVar37,2,0x10);
    }
  }
  if (bVar8 == false && local_440 != (QMakeEvaluator *)0x0) {
    LOCK();
    *(int *)&(((QString *)&local_440->m_caller)->d).d =
         *(int *)&(((QString *)&local_440->m_caller)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&local_440->m_caller)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_440,2,0x10);
    }
  }
  pQVar28 = pQVar30;
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  if (bVar10 == false) {
    pQVar31 = (QMakeProject *)(((QString *)&pQVar30->m_caller)->d).d;
    auVar35 = (undefined1  [8])local_78;
    ProKey::ProKey((ProKey *)auVar35,"QMAKE_APP_FLAG");
    bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)auVar35);
    if (bVar8) {
      pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
      QVar45.m_data = (storage_type *)0x3;
      QVar45.m_size = (qsizetype)local_b8;
      QString::fromUtf8(QVar45);
      auVar35 = local_b8;
      config_02.m_data = (storage_type_conflict *)pQStack_b0;
      config_02.m_size = (qsizetype)local_a8.d.ptr;
      bVar9 = QMakeEvaluator::isActiveConfig(pQVar30,config_02,false);
      pQVar30 = pQVar28;
    }
    else {
      bVar9 = true;
      pQVar30 = pQVar28;
    }
    if (bVar8 && auVar35 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d =
           *(int *)&(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)auVar35,2,0x10);
      }
    }
    pQVar28 = pQVar30;
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_78)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    if (bVar9 != false) {
      ProStringList::removeAll((ProStringList *)pQVar16,"staticlib");
    }
  }
  else {
    qVar24 = QtPrivate::indexOf<ProString,char[4]>(pQVar16,(char (*) [4])0x2b0534,0);
    if (qVar24 == -1) {
      ProString::ProString((ProString *)local_78,"dll");
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)local_78);
      QList<ProString>::end(pQVar16);
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_78)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
    }
  }
  pQVar31 = (QMakeProject *)(((QString *)&pQVar30->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_INCREMENTAL");
  bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar31 = (QMakeProject *)(((QString *)&pQVar28->m_caller)->d).d;
  if (bVar8) {
    auVar35 = (undefined1  [8])local_78;
    ProKey::ProKey((ProKey *)auVar35,"QMAKE_LFLAGS_PREBIND");
    bVar9 = QMakeProject::isEmpty(pQVar31,(ProKey *)auVar35);
    bVar8 = true;
    pQVar30 = pQVar28;
    if (bVar9) {
LAB_001a7918:
      pQVar28 = pQVar30;
      bVar10 = false;
    }
    else {
      auVar35 = (undefined1  [8])(((QString *)&pQVar28->m_caller)->d).d;
      ProKey::ProKey((ProKey *)&local_118,"QMAKE_LIB_FLAG");
      pPVar25 = QMakeEvaluator::valuesRef((QMakeEvaluator *)auVar35,(ProKey *)&local_118);
      if ((pPVar25->super_QList<ProString>).d.size == 0) goto LAB_001a7918;
      pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
      QVar46.m_data = (storage_type *)0x3;
      QVar46.m_size = (qsizetype)local_b8;
      QString::fromUtf8(QVar46);
      auVar35 = local_b8;
      bVar8 = false;
      config_03.m_data = (storage_type_conflict *)pQStack_b0;
      config_03.m_size = (qsizetype)local_a8.d.ptr;
      bVar10 = QMakeEvaluator::isActiveConfig(pQVar28,config_03,false);
      pQVar28 = pQVar30;
    }
    if (auVar35 != (undefined1  [8])0x0 && !bVar8) {
      LOCK();
      *(int *)&(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d =
           *(int *)&(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)auVar35,2,0x10);
      }
    }
    if ((!bVar9) && ((QMakeEvaluator *)local_118.m_string.d.d != (QMakeEvaluator *)0x0)) {
      LOCK();
      *(int *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_118.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_118.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_78)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    pQVar30 = pQVar28;
    if (bVar10 != false) {
      pQVar31 = (QMakeProject *)(((QString *)&pQVar28->m_caller)->d).d;
      pcVar33 = "QMAKE_LFLAGS_PREBIND";
      goto LAB_001a79ab;
    }
  }
  else {
    pcVar33 = "QMAKE_LFLAGS_INCREMENTAL";
LAB_001a79ab:
    pQVar30 = pQVar28;
    ProKey::ProKey((ProKey *)local_78,pcVar33);
    pPVar25 = QMakeEvaluator::valuesRef(&pQVar31->super_QMakeEvaluator,(ProKey *)local_78);
    pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
    ProKey::ProKey((ProKey *)local_b8,"QMAKE_LFLAGS");
    pPVar26 = QMakeEvaluator::valuesRef(pQVar36,(ProKey *)local_b8);
    pPVar2 = (pPVar25->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar26,pPVar2,
               pPVar2 + (pPVar25->super_QList<ProString>).d.size);
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_b8)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_78)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
  }
  pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_INCDIR_POST");
  pPVar25 = QMakeEvaluator::valuesRef(pQVar36,(ProKey *)local_78);
  pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_b8,"QMAKE_INCDIR");
  pPVar26 = QMakeEvaluator::valuesRef(pQVar36,(ProKey *)local_b8);
  pPVar2 = (pPVar25->super_QList<ProString>).d.ptr;
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)pPVar26,pPVar2,
             pPVar2 + (pPVar25->super_QList<ProString>).d.size);
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_b8)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_RPATHDIR_POST");
  pPVar25 = QMakeEvaluator::valuesRef(pQVar36,(ProKey *)local_78);
  pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_b8,"QMAKE_RPATHDIR");
  pPVar26 = QMakeEvaluator::valuesRef(pQVar36,(ProKey *)local_b8);
  pPVar2 = (pPVar25->super_QList<ProString>).d.ptr;
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)pPVar26,pPVar2,
             pPVar2 + (pPVar25->super_QList<ProString>).d.size);
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_b8)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_RPATHLINKDIR_POST");
  pPVar25 = QMakeEvaluator::valuesRef(pQVar36,(ProKey *)local_78);
  pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_b8,"QMAKE_RPATHLINKDIR");
  pPVar26 = QMakeEvaluator::valuesRef(pQVar36,(ProKey *)local_b8);
  pPVar2 = (pPVar25->super_QList<ProString>).d.ptr;
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)pPVar26,pPVar2,
             pPVar2 + (pPVar25->super_QList<ProString>).d.size);
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_b8)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar31 = (QMakeProject *)(((QString *)&pQVar28->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_INCDIR");
  bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  if (!bVar8) {
    pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_INCDIR");
    pPVar25 = QMakeEvaluator::valuesRef(pQVar36,(ProKey *)local_78);
    pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
    ProKey::ProKey((ProKey *)local_b8,"INCLUDEPATH");
    pPVar26 = QMakeEvaluator::valuesRef(pQVar36,(ProKey *)local_b8);
    pPVar2 = (pPVar25->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar26,pPVar2,
               pPVar2 + (pPVar25->super_QList<ProString>).d.size);
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_b8)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_78)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
  }
  local_228.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_228.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_228.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar31 = (this->super_MakefileGenerator).project;
  pUVar74 = this;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_LIBDIR_FLAGS");
  pPVar25 = QMakeEvaluator::valuesRef(&pQVar31->super_QMakeEvaluator,(ProKey *)local_78);
  ProKey::ProKey((ProKey *)local_b8,"QMAKE_LIBDIR");
  libdirToFlags((ProStringList *)&local_148,this,(ProKey *)local_b8);
  local_228.d = (pPVar25->super_QList<ProString>).d.d;
  local_228.ptr = (pPVar25->super_QList<ProString>).d.ptr;
  local_228.size = (pPVar25->super_QList<ProString>).d.size;
  if ((QMakeEvaluator *)local_228.d != (QMakeEvaluator *)0x0) {
    LOCK();
    (((QArrayData *)&((QMakeEvaluator *)local_228.d)->m_caller)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((QMakeEvaluator *)local_228.d)->m_caller)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)&local_228,(ProString *)local_148.m_string.d.ptr,
             (ProString *)(local_148.m_string.d.size * 0x30 + (long)local_148.m_string.d.ptr));
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_148);
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_b8)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  local_238.d.ptr = (totally_ordered_wrapper<QMakeFeatureRoots_*>)&DAT_aaaaaaaaaaaaaaaa;
  local_250._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_240 = (QMakeParser *)&DAT_aaaaaaaaaaaaaaaa;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_LIBDIR_POST");
  libdirToFlags((ProStringList *)(local_250 + 8),pUVar74,(ProKey *)local_78);
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
  QVar47.m_data = (storage_type *)0x3;
  QVar47.m_size = (qsizetype)local_78;
  QString::fromUtf8(QVar47);
  auVar35 = local_78;
  config_04.m_data = (storage_type_conflict *)auStack_70._0_8_;
  config_04.m_size = auStack_70._8_8_;
  bVar8 = QMakeEvaluator::isActiveConfig(pQVar28,config_04,false);
  if (auVar35 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)auVar35)->d).d = *(int *)&(((QString *)auVar35)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)auVar35)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)auVar35,2,0x10);
    }
  }
  pQVar28 = pQVar30;
  if (bVar8) {
    pQVar31 = (QMakeProject *)(((QString *)&pQVar30->m_caller)->d).d;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_FRAMEWORKPATH");
    bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_78)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    if (!bVar8) {
      pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
      ProKey::ProKey((ProKey *)local_78,"QMAKE_FRAMEWORKPATH");
      pPVar25 = QMakeEvaluator::valuesRef(pQVar28,(ProKey *)local_78);
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_78)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      if ((pPVar25->super_QList<ProString>).d.size != 0) {
        lVar32 = 0;
        uVar38 = 0;
        do {
          pUVar75 = pUVar74;
          MakefileGenerator::escapeFilePath
                    (&local_148,&pUVar74->super_MakefileGenerator,
                     (ProString *)
                     ((long)&(((pPVar25->super_QList<ProString>).d.ptr)->m_string).d.d + lVar32));
          local_78 = (undefined1  [8])anon_var_dwarf_a18d5;
          ProString::ProString((ProString *)auStack_70,&local_148);
          ProString::ProString<char_const(&)[3],ProString>
                    ((ProString *)local_b8,(QStringBuilder<const_char_(&)[3],_ProString> *)local_78)
          ;
          pQVar31 = (pUVar74->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)local_178,"QMAKE_FRAMEWORKPATH_FLAGS");
          pQVar16 = &QMakeEvaluator::valuesRef(&pQVar31->super_QMakeEvaluator,(ProKey *)local_178)->
                     super_QList<ProString>;
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)local_b8)
          ;
          QList<ProString>::end(pQVar16);
          pUVar74 = pUVar75;
          if ((QMakeFeatureRoots *)local_178._0_8_ != (QMakeFeatureRoots *)0x0) {
            LOCK();
            *(int *)local_178._0_8_ = *(int *)local_178._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_178._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_178._0_8_,2,0x10);
              pUVar74 = pUVar75;
            }
          }
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_b8)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
          if ((QMakeEvaluator *)auStack_70._0_8_ != (QMakeEvaluator *)0x0) {
            LOCK();
            *(int *)&(((QString *)auStack_70._0_8_)->d).d =
                 *(int *)&(((QString *)auStack_70._0_8_)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)auStack_70._0_8_)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)auStack_70._0_8_,2,0x10);
            }
          }
          if ((QMakeFeatureRoots *)local_148.m_string.d.d != (QMakeFeatureRoots *)0x0) {
            LOCK();
            *(int *)local_148.m_string.d.d = *(int *)local_148.m_string.d.d + -1;
            UNLOCK();
            if (*(int *)local_148.m_string.d.d == 0) {
              QArrayData::deallocate(&(local_148.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          uVar38 = uVar38 + 1;
          lVar32 = lVar32 + 0x30;
        } while (uVar38 < (ulong)(pPVar25->super_QList<ProString>).d.size);
      }
    }
    pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
    pQVar28 = pQVar30;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_FRAMEWORKPATH_FLAGS");
    pPVar25 = QMakeEvaluator::valuesRef(pQVar36,(ProKey *)local_78);
    pPVar2 = (pPVar25->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)&local_228,pPVar2,
               pPVar2 + (pPVar25->super_QList<ProString>).d.size);
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_78)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
  }
  pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_78,"LIBS");
  pPVar25 = QMakeEvaluator::valuesRef(pQVar36,(ProKey *)local_78);
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  local_b8 = (undefined1  [8])local_228.d;
  pQStack_b0 = (QMakeEvaluator *)local_228.ptr;
  local_a8.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
        )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
          )local_228.size;
  if ((QMakeEvaluator *)local_228.d != (QMakeEvaluator *)0x0) {
    LOCK();
    ((local_228.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_228.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pPVar2 = (pPVar25->super_QList<ProString>).d.ptr;
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)local_b8,pPVar2,
             pPVar2 + (pPVar25->super_QList<ProString>).d.size);
  QVar34.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                  )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                    )local_a8;
  pQVar36 = pQStack_b0;
  auVar35 = local_b8;
  local_b8 = (undefined1  [8])0x0;
  pQStack_b0 = (QMakeEvaluator *)0x0;
  local_a8.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
        )(QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
          *)0x0;
  local_78 = (undefined1  [8])(pPVar25->super_QList<ProString>).d.d;
  auStack_70._0_8_ = (pPVar25->super_QList<ProString>).d.ptr;
  (pPVar25->super_QList<ProString>).d.d = (Data *)auVar35;
  (pPVar25->super_QList<ProString>).d.ptr = (ProString *)pQVar36;
  auStack_70._8_8_ = (pPVar25->super_QList<ProString>).d.size;
  (pPVar25->super_QList<ProString>).d.size = (qsizetype)QVar34.d.ptr;
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_78);
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_b8);
  pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_LIBS");
  pPVar25 = QMakeEvaluator::valuesRef(pQVar36,(ProKey *)local_78);
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  local_b8 = (undefined1  [8])local_250._8_8_;
  pQStack_b0 = (QMakeEvaluator *)pQStack_240;
  local_a8.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
        )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
          )local_238.d.ptr;
  if ((QMakeEvaluator *)local_250._8_8_ != (QMakeEvaluator *)0x0) {
    LOCK();
    (((QArrayData *)local_250._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)local_250._8_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pPVar2 = (pPVar25->super_QList<ProString>).d.ptr;
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)local_b8,pPVar2,
             pPVar2 + (pPVar25->super_QList<ProString>).d.size);
  QVar34.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                  )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                    )local_a8;
  pQVar36 = pQStack_b0;
  auVar35 = local_b8;
  local_b8 = (undefined1  [8])0x0;
  pQStack_b0 = (QMakeEvaluator *)0x0;
  local_a8.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
        )(QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
          *)0x0;
  local_78 = (undefined1  [8])(pPVar25->super_QList<ProString>).d.d;
  auStack_70._0_8_ = (pPVar25->super_QList<ProString>).d.ptr;
  (pPVar25->super_QList<ProString>).d.d = (Data *)auVar35;
  (pPVar25->super_QList<ProString>).d.ptr = (ProString *)pQVar36;
  auStack_70._8_8_ = (pPVar25->super_QList<ProString>).d.size;
  (pPVar25->super_QList<ProString>).d.size = (qsizetype)QVar34.d.ptr;
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_78);
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_b8);
  pQVar31 = (QMakeProject *)(((QString *)&pQVar30->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_RPATHDIR");
  bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
  if (bVar8) {
    bVar8 = false;
  }
  else {
    pQVar31 = (QMakeProject *)(((QString *)&pQVar30->m_caller)->d).d;
    ProKey::ProKey((ProKey *)&local_148,"QMAKE_LFLAGS_RPATH");
    bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)&local_148);
    bVar8 = !bVar8;
    if ((QMakeFeatureRoots *)local_148.m_string.d.d != (QMakeFeatureRoots *)0x0) {
      LOCK();
      *(int *)local_148.m_string.d.d = *(int *)local_148.m_string.d.d + -1;
      UNLOCK();
      if (*(int *)local_148.m_string.d.d == 0) {
        QArrayData::deallocate(&(local_148.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  if (bVar8) {
    pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_RPATHDIR");
    pPVar25 = QMakeEvaluator::valuesRef(pQVar30,(ProKey *)local_78);
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_78)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    if ((pPVar25->super_QList<ProString>).d.size != 0) {
      lVar32 = 0;
      uVar38 = 0;
      pPVar26 = pPVar25;
      do {
        local_2d8 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
        local_2e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        pQStack_2e0 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
        ProString::toQString
                  ((QString *)local_2e8,
                   (ProString *)
                   ((long)&(((pPVar25->super_QList<ProString>).d.ptr)->m_string).d.d + lVar32));
        if (((local_2d8 < (QMakeEvaluator *)0x2) ||
            (*(short *)&(((ProString *)&pQStack_2e0->m_caller)->m_string).d.d != 0x24)) ||
           (*(short *)((long)&(((ProString *)&pQStack_2e0->m_caller)->m_string).d.d + 2) == 0x28)) {
          cVar11 = QString::startsWith((QChar)(char16_t)(QString *)local_2e8,0x40);
          if (cVar11 == '\0') {
            local_268 = (QMakeEvaluator *)local_2e8;
            local_260 = pQStack_2e0;
            pQStack_258 = local_2d8;
            if (local_2e8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&(((QString *)local_2e8)->d).d = *(int *)&(((QString *)local_2e8)->d).d + 1;
              UNLOCK();
            }
            file.d.ptr = (char16_t *)pUVar74;
            file.d.d = (Data *)pQVar28;
            file.d.size = (qsizetype)pPVar26;
            MakefileGenerator::fileInfo((MakefileGenerator *)local_250,file);
            cVar12 = QFileInfo::isRelative();
          }
          else {
            cVar12 = '\0';
          }
          if ((cVar11 == '\0') &&
             (QFileInfo::~QFileInfo((QFileInfo *)local_250), local_268 != (QMakeEvaluator *)0x0)) {
            LOCK();
            *(int *)&(((QString *)&local_268->m_caller)->d).d =
                 *(int *)&(((QString *)&local_268->m_caller)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&local_268->m_caller)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_268,2,0x10);
            }
          }
          if (cVar12 == '\0') goto LAB_001a895b;
          local_168.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_178._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_178._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
          ProKey::ProKey((ProKey *)local_b8,"QMAKE_REL_RPATH_BASE");
          QMakeEvaluator::first((ProString *)local_78,pQVar30,(ProKey *)local_b8);
          ProString::toQString((QString *)local_178,(ProString *)local_78);
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_78)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          auVar35 = local_b8;
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)auVar35)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
          QVar7.d = local_168.d;
          if ((ProFile *)local_168.d == (ProFile *)0x0) {
            init(local_280);
          }
          else {
            cVar11 = QString::startsWith((QChar)(char16_t)local_178,0x24);
            pQVar30 = pQVar28;
            pPVar25 = pPVar26;
            if (cVar11 != '\0') {
              QVar48.m_data = (storage_type *)0x3;
              QVar48.m_size = (qsizetype)local_78;
              QString::fromUtf8(QVar48);
              local_b8 = local_78;
              pQStack_b0 = (QMakeEvaluator *)auStack_70._0_8_;
              local_a8.d.ptr =
                   (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                    )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                      )auStack_70._8_8_;
              QString::replace((longlong)local_178,0,(QString *)0x1);
              pQVar30 = pQVar28;
              pPVar25 = pPVar26;
              if (local_b8 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_b8)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
                  pQVar30 = pQVar28;
                  pPVar25 = pPVar26;
                }
              }
            }
            bVar8 = comparesEqual((QString *)local_2e8,".");
            if (bVar8) {
              QString::operator=((QString *)local_2e8,(QString *)local_178);
            }
            else {
              local_b8 = (undefined1  [8])local_178;
              pQStack_b0 = (QMakeEvaluator *)CONCAT71(pQStack_b0._1_7_,0x2f);
              QStringBuilder<QString_&,_char>::convertTo<QString>
                        ((QString *)local_78,(QStringBuilder<QString_&,_char> *)local_b8);
              pQVar28 = (QMakeEvaluator *)auStack_70._0_8_;
              if ((QMakeEvaluator *)auStack_70._0_8_ == (QMakeEvaluator *)0x0) {
                pQVar28 = (QMakeEvaluator *)&QString::_empty;
              }
              QString::insert((longlong)local_2e8,(QChar *)0x0,(longlong)pQVar28);
              if (local_78 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_78)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_78,2,0x10);
                }
              }
            }
            pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
            pQVar28 = pQVar30;
            ProKey::ProKey((ProKey *)local_78,"QMAKE_LFLAGS");
            pPVar26 = QMakeEvaluator::valuesRef(pQVar36,(ProKey *)local_78);
            pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
            ProKey::ProKey((ProKey *)local_b8,"QMAKE_LFLAGS_REL_RPATH");
            value = QMakeEvaluator::valuesRef(pQVar30,(ProKey *)local_b8);
            ProStringList::insertUnique(pPVar26,value);
            auVar35 = local_b8;
            if (local_b8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)auVar35)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
              }
            }
            pPVar26 = pPVar25;
            if (local_78 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_78)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_78,2,0x10);
              }
            }
          }
          if ((QMakeFeatureRoots *)local_178._0_8_ != (QMakeFeatureRoots *)0x0) {
            LOCK();
            *(int *)local_178._0_8_ = *(int *)local_178._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_178._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_178._0_8_,2,0x10);
            }
          }
          if ((ProFile *)QVar7.d != (ProFile *)0x0) goto LAB_001a895b;
        }
        else {
          QVar49.m_data = (storage_type *)0x3;
          QVar49.m_size = (qsizetype)local_78;
          QString::fromUtf8(QVar49);
          local_b8 = local_78;
          pQStack_b0 = (QMakeEvaluator *)auStack_70._0_8_;
          local_a8.d.ptr =
               (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                  )auStack_70._8_8_;
          QString::replace((longlong)local_2e8,0,(QString *)0x1);
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_b8)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
LAB_001a895b:
          ProKey::ProKey((ProKey *)local_178,"QMAKE_LFLAGS_RPATH");
          pUVar75 = pUVar74;
          (*(pUVar74->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
            [0x16])(local_318,pUVar74,(ProKey *)local_178);
          (*(pUVar74->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
            [0xc])(local_348,pUVar74,local_2e8);
          local_a8.d.ptr =
               (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                  )local_308;
          pQStack_b0 = pQStack_310;
          local_b8 = local_318;
          local_90 = local_338;
          pQStack_98 = pQStack_340;
          pQStack_a0 = (QMakeEvaluator *)local_348;
          local_318 = (undefined1  [8])0x0;
          pQStack_310 = (QMakeEvaluator *)0x0;
          local_308 = (QMakeEvaluator *)0x0;
          local_348 = (undefined1  [8])0x0;
          pQStack_340 = (QMakeEvaluator *)0x0;
          local_338 = (QMakeEvaluator *)0x0;
          ProString::ProString<QString,QString>
                    ((ProString *)local_78,(QStringBuilder<QString,_QString> *)local_b8);
          pQVar31 = (pUVar74->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)&local_2b0,"QMAKE_LFLAGS");
          pQVar16 = &QMakeEvaluator::valuesRef(&pQVar31->super_QMakeEvaluator,(ProKey *)&local_2b0)
                     ->super_QList<ProString>;
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)local_78)
          ;
          QList<ProString>::end(pQVar16);
          pUVar74 = pUVar75;
          pPVar25 = pPVar26;
          if (&(local_2b0.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_2b0.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_2b0.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_2b0.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_2b0.m_string.d.d)->super_QArrayData,2,0x10);
              pUVar74 = pUVar75;
              pPVar25 = pPVar26;
            }
          }
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_78)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          QStringBuilder<QString,_QString>::~QStringBuilder
                    ((QStringBuilder<QString,_QString> *)local_b8);
          pPVar26 = pPVar25;
          if (local_348 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_348)->d).d = *(int *)&(((QString *)local_348)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_348)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_348,2,0x10);
            }
          }
          if (local_318 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_318)->d).d = *(int *)&(((QString *)local_318)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_318)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_318,2,0x10);
            }
          }
          if ((QMakeFeatureRoots *)local_178._0_8_ != (QMakeFeatureRoots *)0x0) {
            LOCK();
            *(int *)local_178._0_8_ = *(int *)local_178._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_178._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_178._0_8_,2,0x10);
            }
          }
        }
        if (local_2e8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_2e8)->d).d = *(int *)&(((QString *)local_2e8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_2e8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_2e8,2,0x10);
          }
        }
        uVar38 = uVar38 + 1;
        lVar32 = lVar32 + 0x30;
      } while (uVar38 < (ulong)(pPVar25->super_QList<ProString>).d.size);
    }
  }
  pQVar31 = (QMakeProject *)(((QString *)&pQVar28->m_caller)->d).d;
  pQVar30 = pQVar28;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_RPATHLINKDIR");
  bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  if (!bVar8) {
    pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_RPATHLINKDIR");
    pPVar25 = QMakeEvaluator::valuesRef(pQVar36,(ProKey *)local_78);
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_78)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    if ((pPVar25->super_QList<ProString>).d.size != 0) {
      lVar32 = 0;
      uVar38 = 0;
      pPVar26 = pPVar25;
      do {
        pQVar31 = (QMakeProject *)(((QString *)&pQVar28->m_caller)->d).d;
        ProKey::ProKey((ProKey *)local_78,"QMAKE_LFLAGS_RPATHLINK");
        bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
        pQVar28 = pQVar30;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_78)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            pQVar28 = pQVar30;
          }
        }
        if (!bVar8) {
          ProKey::ProKey((ProKey *)local_178,"QMAKE_LFLAGS_RPATHLINK");
          pUVar75 = pUVar74;
          (*(pUVar74->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
            [0x16])(local_2e8,pUVar74,(ProKey *)local_178);
          ProString::toQString
                    ((QString *)local_378,
                     (ProString *)
                     ((long)&(((pPVar25->super_QList<ProString>).d.ptr)->m_string).d.d + lVar32));
          QFileInfo::QFileInfo((QFileInfo *)&local_3a8,(QString *)local_378);
          QFileInfo::absoluteFilePath();
          (*(pUVar74->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
            [0xc])(local_318,pUVar74,local_348);
          local_a8.d.ptr =
               (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                  )local_2d8;
          pQStack_b0 = pQStack_2e0;
          local_b8 = local_2e8;
          local_90 = local_308;
          pQStack_98 = pQStack_310;
          pQStack_a0 = (QMakeEvaluator *)local_318;
          local_2e8 = (undefined1  [8])0x0;
          pQStack_2e0 = (QMakeEvaluator *)0x0;
          local_2d8 = (QMakeEvaluator *)0x0;
          local_318 = (undefined1  [8])0x0;
          pQStack_310 = (QMakeEvaluator *)0x0;
          local_308 = (QMakeEvaluator *)0x0;
          ProString::ProString<QString,QString>
                    ((ProString *)local_78,(QStringBuilder<QString,_QString> *)local_b8);
          pQVar31 = (pUVar74->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)&local_2b0,"QMAKE_LFLAGS");
          pQVar16 = &QMakeEvaluator::valuesRef(&pQVar31->super_QMakeEvaluator,(ProKey *)&local_2b0)
                     ->super_QList<ProString>;
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)local_78)
          ;
          QList<ProString>::end(pQVar16);
          pUVar74 = pUVar75;
          pPVar25 = pPVar26;
          if (&(local_2b0.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_2b0.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_2b0.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_2b0.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_2b0.m_string.d.d)->super_QArrayData,2,0x10);
              pUVar74 = pUVar75;
              pPVar25 = pPVar26;
            }
          }
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_78)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          QStringBuilder<QString,_QString>::~QStringBuilder
                    ((QStringBuilder<QString,_QString> *)local_b8);
          pPVar26 = pPVar25;
          if (local_318 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_318)->d).d = *(int *)&(((QString *)local_318)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_318)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_318,2,0x10);
            }
          }
          if (local_348 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_348)->d).d = *(int *)&(((QString *)local_348)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_348)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_348,2,0x10);
            }
          }
          QFileInfo::~QFileInfo((QFileInfo *)&local_3a8);
          if (local_378 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_378)->d).d = *(int *)&(((QString *)local_378)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_378)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_378,2,0x10);
            }
          }
          if (local_2e8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_2e8)->d).d = *(int *)&(((QString *)local_2e8)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_2e8)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_2e8,2,0x10);
            }
          }
          if ((QMakeFeatureRoots *)local_178._0_8_ != (QMakeFeatureRoots *)0x0) {
            LOCK();
            *(int *)local_178._0_8_ = *(int *)local_178._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_178._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_178._0_8_,2,0x10);
            }
          }
        }
        uVar38 = uVar38 + 1;
        lVar32 = lVar32 + 0x30;
        pQVar30 = pQVar28;
      } while (uVar38 < (ulong)(pPVar25->super_QList<ProString>).d.size);
    }
  }
  pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
  QVar50.m_data = (storage_type *)0x7;
  QVar50.m_size = (qsizetype)local_78;
  QString::fromUtf8(QVar50);
  auVar35 = local_78;
  bVar8 = false;
  config_05.m_data = (storage_type_conflict *)auStack_70._0_8_;
  config_05.m_size = auStack_70._8_8_;
  QVar34.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                  )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                    )auStack_70._8_8_;
  bVar9 = QMakeEvaluator::isActiveConfig(pQVar28,config_05,false);
  if (bVar9) {
    pQVar31 = (QMakeProject *)(((QString *)&pQVar30->m_caller)->d).d;
    QVar34.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                    )local_178;
    ProKey::ProKey((ProKey *)QVar34.d.ptr,"QMAKE_CFLAGS_DEPS");
    bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)QVar34.d.ptr);
    bVar8 = !bVar8;
    if ((QMakeFeatureRoots *)local_178._0_8_ != (QMakeFeatureRoots *)0x0) {
      LOCK();
      *(int *)local_178._0_8_ = *(int *)local_178._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_178._0_8_ == 0) {
        QVar34.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                        )(QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
                          *)0x2;
        QArrayData::deallocate((QArrayData *)local_178._0_8_,2,0x10);
      }
    }
  }
  if (auVar35 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)auVar35)->d).d = *(int *)&(((QString *)auVar35)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)auVar35)->d).d == 0) {
      QVar34.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                      )(QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
                        *)0x2;
      QArrayData::deallocate((QArrayData *)auVar35,2,0x10);
    }
  }
  if (bVar8) {
    pUVar74->include_deps = true;
  }
  pUVar75 = pUVar74;
  MakefileGenerator::init(&pUVar74->super_MakefileGenerator,(EVP_PKEY_CTX *)QVar34.d.ptr);
  pQVar31 = (pUVar74->super_MakefileGenerator).project;
  QVar51.m_data = (storage_type *)0xb;
  QVar51.m_size = (qsizetype)local_78;
  QString::fromUtf8(QVar51);
  auVar35 = local_78;
  config_06.m_data = (storage_type_conflict *)auStack_70._0_8_;
  config_06.m_size = auStack_70._8_8_;
  bVar8 = QMakeEvaluator::isActiveConfig(&pQVar31->super_QMakeEvaluator,config_06,false);
  if (auVar35 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)auVar35)->d).d = *(int *)&(((QString *)auVar35)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)auVar35)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)auVar35,2,0x10);
    }
  }
  pQVar28 = pQVar30;
  if (bVar8) {
    pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_BUILTIN_COMPILERS");
    pQVar16 = &QMakeEvaluator::valuesRef(pQVar36,(ProKey *)local_78)->super_QList<ProString>;
    ProString::ProString((ProString *)local_b8,"OBJC");
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
              ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)local_b8);
    QList<ProString>::end(pQVar16);
    ProString::ProString(&local_2b0,"OBJCXX");
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
              ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,&local_2b0);
    QList<ProString>::end(pQVar16);
    if (&(local_2b0.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2b0.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2b0.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_2b0.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_2b0.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    auVar35 = local_b8;
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)auVar35)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_78)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
  }
  pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_BUILTIN_COMPILERS");
  pQVar16 = &QMakeEvaluator::valuesRef(pQVar36,(ProKey *)local_78)->super_QList<ProString>;
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  iVar21 = QList<ProString>::begin(pQVar16);
  local_440 = (QMakeEvaluator *)QList<ProString>::end(pQVar16);
  while ((QMakeEvaluator *)iVar21.i != local_440) {
    local_3a8.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_3a8.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_3a8.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_COMPILE_FLAG");
    (*(pUVar75->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
              (&local_3a8,pUVar75,(ProKey *)local_78);
    auVar35 = local_78;
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)auVar35)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    if ((ProFile **)local_3a8.super_ProString.m_string.d.size == (ProFile **)0x0) {
      QVar52.m_size = (size_t)"-c";
      QVar52.field_0.m_data = &local_3a8;
      QString::assign(QVar52);
    }
    iVar15 = (*(pUVar75->super_MakefileGenerator).super_QMakeSourceFileInfo.
               _vptr_QMakeSourceFileInfo[0x21])();
    if ((char)iVar15 == '\0') {
      bVar8 = false;
    }
    else {
      pQVar31 = (QMakeProject *)(((QString *)&pQVar30->m_caller)->d).d;
      ProKey::ProKey((ProKey *)&local_2b0,"PRECOMPILED_HEADER");
      bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)&local_2b0);
      bVar8 = !bVar8;
    }
    pQVar36 = (QMakeEvaluator *)iVar21.i;
    if (((char)iVar15 != '\0') && (&(local_2b0.m_string.d.d)->super_QArrayData != (QArrayData *)0x0)
       ) {
      LOCK();
      ((local_2b0.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2b0.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_2b0.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_2b0.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar8) {
      local_308 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
      local_318 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      pQStack_310 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8 = (undefined1  [8])0x2a8eb2;
      local_a8.d.ptr =
           (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
            )(QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
              *)0x2aa351;
      pQStack_b0 = (QMakeEvaluator *)iVar21.i;
      ProString::ProString<QStringBuilder<char_const(&)[7],ProString_const&>,char_const(&)[21]>
                ((ProString *)local_78,
                 (QStringBuilder<QStringBuilder<const_char_(&)[7],_const_ProString_&>,_const_char_(&)[21]>
                  *)local_b8);
      (*(pUVar75->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16]
      )(local_318,pUVar75,(ProString *)local_78);
      auVar35 = local_78;
      iVar21.i = (ProString *)pQVar36;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)auVar35)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          iVar21.i = (ProString *)pQVar36;
        }
      }
      local_348 = (undefined1  [8])0x0;
      pQStack_340 = (QMakeEvaluator *)0x0;
      local_338 = (QMakeEvaluator *)0x0;
      pQVar31 = (QMakeProject *)(((QString *)&pQVar30->m_caller)->d).d;
      ProKey::ProKey((ProKey *)local_78,"PRECOMPILED_DIR");
      bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
      auVar35 = local_78;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)auVar35)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      if (!bVar8) {
        pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
        ProKey::ProKey((ProKey *)local_b8,"PRECOMPILED_DIR");
        QMakeEvaluator::first((ProString *)local_78,pQVar36,(ProKey *)local_b8);
        ProString::toQString((QString *)local_3d8,(ProString *)local_78);
        local_2e8 = local_3d8;
        pQStack_2e0 = pQStack_3d0;
        local_2d8 = pQStack_3c8;
        if (local_3d8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_3d8)->d).d = *(int *)&(((QString *)local_3d8)->d).d + 1;
          UNLOCK();
        }
        string.d.ptr = (char16_t *)pUVar75;
        string.d.d = (Data *)pQVar28;
        string.d.size = (qsizetype)iVar21.i;
        Option::fixString((QString *)local_378,string,(uchar)local_2e8);
        if (local_2e8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_2e8)->d).d = *(int *)&(((QString *)local_2e8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_2e8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_2e8,2,0x10);
          }
        }
        pQVar3 = pQStack_340;
        auVar37 = local_348;
        pQVar36 = local_368;
        auVar35 = local_378;
        local_378 = local_348;
        local_348 = auVar35;
        pQStack_340 = pQStack_370;
        pQStack_370 = pQVar3;
        local_368 = local_338;
        local_338 = pQVar36;
        if (auVar37 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)auVar37)->d).d = *(int *)&(((QString *)auVar37)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)auVar37)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)auVar37,2,0x10);
          }
        }
        if (local_3d8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_3d8)->d).d = *(int *)&(((QString *)local_3d8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_3d8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_3d8,2,0x10);
          }
        }
        auVar35 = local_78;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)auVar35)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        if (local_b8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_b8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
          }
        }
        cVar11 = QString::endsWith((QString *)local_348,0x2e2bf0);
        if (cVar11 == '\0') {
          QString::append((QString *)local_348);
        }
      }
      pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
      ProKey::ProKey((ProKey *)local_b8,"QMAKE_ORIG_TARGET");
      QMakeEvaluator::first((ProString *)local_78,pQVar30,(ProKey *)local_b8);
      ProString::toQString((QString *)local_2e8,(ProString *)local_78);
      QString::append((QString *)local_348);
      if (local_2e8 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_2e8)->d).d = *(int *)&(((QString *)local_2e8)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_2e8)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_2e8,2,0x10);
        }
      }
      auVar35 = local_78;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)auVar35)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      if (local_b8 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_b8)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
        }
      }
      pQVar31 = (pUVar75->super_MakefileGenerator).project;
      pUVar74 = pUVar75;
      ProKey::ProKey((ProKey *)local_b8,"PRECOMPILED_HEADER");
      QMakeEvaluator::first((ProString *)local_78,&pQVar31->super_QMakeEvaluator,(ProKey *)local_b8)
      ;
      ProString::toQString((QString *)local_378,(ProString *)local_78);
      (*(pUVar75->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                (local_2e8,pUVar75,(QMakeEvaluator *)local_378);
      QVar53.m_data = (char *)0x12;
      QVar53.m_size = (qsizetype)local_318;
      QString::replace(QVar53,(QString *)"${QMAKE_PCH_INPUT}",(CaseSensitivity)local_2e8);
      if (local_2e8 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_2e8)->d).d = *(int *)&(((QString *)local_2e8)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_2e8)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_2e8,2,0x10);
        }
      }
      if (local_378 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_378)->d).d = *(int *)&(((QString *)local_378)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_378)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_378,2,0x10);
        }
      }
      auVar35 = local_78;
      pQVar36 = pQVar28;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)auVar35)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      if (local_b8 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_b8)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
        }
      }
      (*(pUVar74->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                (local_78,pUVar74,local_348);
      QVar54.m_data = (char *)0x18;
      QVar54.m_size = (qsizetype)local_318;
      QString::replace(QVar54,(QString *)"${QMAKE_PCH_OUTPUT_BASE}",(CaseSensitivity)local_78);
      auVar35 = local_78;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)auVar35)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
      QVar55.m_data = (storage_type *)0xd;
      QVar55.m_size = (qsizetype)local_78;
      QString::fromUtf8(QVar55);
      auVar35 = local_78;
      config_07.m_data = (storage_type_conflict *)auStack_70._0_8_;
      config_07.m_size = auStack_70._8_8_;
      bVar8 = QMakeEvaluator::isActiveConfig(pQVar30,config_07,false);
      if (auVar35 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)auVar35)->d).d = *(int *)&(((QString *)auVar35)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)auVar35)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)auVar35,2,0x10);
        }
      }
      if (bVar8) {
        pQVar31 = (pUVar74->super_MakefileGenerator).project;
        pUVar75 = pUVar74;
        ProKey::ProKey((ProKey *)local_2e8,"QMAKE_PCH_OUTPUT_EXT");
        QMakeEvaluator::first
                  ((ProString *)local_b8,&pQVar31->super_QMakeEvaluator,(ProKey *)local_2e8);
        local_78 = (undefined1  [8])local_348;
        ProString::ProString((ProString *)auStack_70,(ProString *)local_b8);
        MakefileGenerator::escapeFilePath<QString&,ProString>
                  ((QString *)local_378,&pUVar74->super_MakefileGenerator,
                   (QStringBuilder<QString_&,_ProString> *)local_78);
        QVar56.m_data = (char *)0x13;
        QVar56.m_size = (qsizetype)local_318;
        QString::replace(QVar56,(QString *)"${QMAKE_PCH_OUTPUT}",
                         (CaseSensitivity)(QMakeEvaluator *)local_378);
        if (local_378 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_378)->d).d = *(int *)&(((QString *)local_378)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_378)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_378,2,0x10);
          }
        }
        uVar29 = auStack_70._0_8_;
        if ((QMakeEvaluator *)auStack_70._0_8_ != (QMakeEvaluator *)0x0) {
          LOCK();
          *(int *)&(((ProString *)auStack_70._0_8_)->m_string).d.d =
               *(int *)&(((ProString *)auStack_70._0_8_)->m_string).d.d + -1;
          UNLOCK();
          if (*(int *)&(((ProString *)uVar29)->m_string).d.d == 0) {
            QArrayData::deallocate((QArrayData *)auStack_70._0_8_,2,0x10);
          }
        }
        pQVar30 = pQVar36;
        if (local_b8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_b8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
          }
        }
        if (local_2e8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_2e8)->d).d = *(int *)&(((QString *)local_2e8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_2e8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_2e8,2,0x10);
          }
        }
        local_2d8 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
        local_2e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        pQStack_2e0 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar36->m_caller)->d).d;
        ProKey::ProKey((ProKey *)local_78,"QMAKE_PCH_ARCHS");
        pPVar25 = QMakeEvaluator::valuesRef(pQVar28,(ProKey *)local_78);
        auVar35 = local_78;
        local_2e8 = (undefined1  [8])(pPVar25->super_QList<ProString>).d.d;
        pQStack_2e0 = (QMakeEvaluator *)(pPVar25->super_QList<ProString>).d.ptr;
        local_2d8 = (QMakeEvaluator *)(pPVar25->super_QList<ProString>).d.size;
        if (local_2e8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)&((QMakeEvaluator *)local_2e8)->m_caller)->d).d =
               *(int *)&(((QString *)&((QMakeEvaluator *)local_2e8)->m_caller)->d).d + 1;
          UNLOCK();
        }
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)auVar35)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        if (local_2d8 != (QMakeEvaluator *)0x0) {
          lVar32 = (long)local_2d8 * 0x30;
          QVar34.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                          )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                            )pQStack_2e0;
          do {
            local_368 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
            local_378 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
            pQStack_370 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
            ProKey::ProKey((ProKey *)local_b8,"QMAKE_PCH_OUTPUT_EXT");
            QMakeEvaluator::first((ProString *)local_78,pQVar28,(ProKey *)local_b8);
            ProString::toQString((QString *)local_378,(ProString *)local_78);
            auVar35 = local_78;
            if (local_78 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)auVar35)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_78,2,0x10);
              }
            }
            if (local_b8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_b8)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
              }
            }
            ProString::toQString((QString *)local_78,(ProString *)QVar34.d.ptr);
            QVar57.m_data = (char *)0x11;
            QVar57.m_size = (qsizetype)local_378;
            QString::replace(QVar57,(QString *)"${QMAKE_PCH_ARCH}",
                             (CaseSensitivity)(QString *)local_78);
            auVar35 = local_78;
            if (local_78 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)auVar35)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_78,2,0x10);
              }
            }
            local_78 = (undefined1  [8])0x13;
            auStack_70._0_8_ = "${QMAKE_PCH_OUTPUT_";
            auStack_70[0x10] = 0x7d;
            auStack_70._8_8_ = QVar34.d.ptr;
            QStringBuilder<QStringBuilder<QLatin1String,_const_ProString_&>,_QLatin1Char>::
            convertTo<QString>((QString *)local_b8,
                               (QStringBuilder<QStringBuilder<QLatin1String,_const_ProString_&>,_QLatin1Char>
                                *)local_78);
            local_408.m_string.d.d = (Data *)local_348;
            local_408.m_string.d.ptr = (char16_t *)local_378;
            MakefileGenerator::escapeFilePath<QString&,QString&>
                      ((QString *)local_3d8,&pUVar75->super_MakefileGenerator,
                       (QStringBuilder<QString_&,_QString_&> *)&local_408);
            QString::replace((QString *)local_318,(QString *)local_b8,
                             (CaseSensitivity)(QString *)local_3d8);
            if (local_3d8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&(((QString *)local_3d8)->d).d = *(int *)&(((QString *)local_3d8)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_3d8)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_3d8,2,0x10);
              }
            }
            if (local_b8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_b8)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
              }
            }
            if (local_378 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&(((QString *)local_378)->d).d = *(int *)&(((QString *)local_378)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)local_378)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_378,2,0x10);
              }
            }
            QVar34.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                            )((long)QVar34.d.ptr + 0x30);
            lVar32 = lVar32 + -0x30;
          } while (lVar32 != 0);
        }
        QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_2e8);
        pQVar28 = pQVar30;
        pQVar36 = (QMakeEvaluator *)iVar21.i;
      }
      else {
        local_2e8 = (undefined1  [8])0x0;
        pQStack_2e0 = (QMakeEvaluator *)0x0;
        local_2d8 = (QMakeEvaluator *)0x0;
        pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar36->m_caller)->d).d;
        QVar58.m_data = (storage_type *)0xf;
        QVar58.m_size = (qsizetype)local_78;
        QString::fromUtf8(QVar58);
        auVar35 = local_78;
        config_08.m_data = (storage_type_conflict *)auStack_70._0_8_;
        config_08.m_size = auStack_70._8_8_;
        bVar8 = QMakeEvaluator::isActiveConfig(pQVar30,config_08,false);
        pQVar30 = pQVar36;
        pUVar75 = pUVar74;
        if (auVar35 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)auVar35)->d).d = *(int *)&(((QString *)auVar35)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)auVar35)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)auVar35,2,0x10);
            pQVar30 = pQVar36;
            pUVar75 = pUVar74;
          }
        }
        pQVar28 = pQVar30;
        pQVar36 = (QMakeEvaluator *)iVar21.i;
        if (bVar8) {
          pQVar3 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
          ProKey::ProKey((ProKey *)local_b8,"QMAKE_PCH_OUTPUT_EXT");
          QMakeEvaluator::first((ProString *)local_78,pQVar3,(ProKey *)local_b8);
          ProString::toQString((QString *)local_378,(ProString *)local_78);
          pQVar6 = pQStack_2e0;
          auVar37 = local_2e8;
          pQVar3 = local_368;
          auVar35 = local_378;
          local_378 = local_2e8;
          local_2e8 = auVar35;
          pQStack_2e0 = pQStack_370;
          pQStack_370 = pQVar6;
          local_368 = local_2d8;
          local_2d8 = pQVar3;
          if (auVar37 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)auVar37)->d).d = *(int *)&(((QString *)auVar37)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)auVar37)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)auVar37,2,0x10);
            }
          }
          auVar35 = local_78;
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)auVar35)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_b8)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
        }
        pQVar3 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
        ProKey::ProKey((ProKey *)local_b8,"QMAKE_PCH_OUTPUT_EXT");
        QMakeEvaluator::first((ProString *)local_78,pQVar3,(ProKey *)local_b8);
        ProString::toQString((QString *)local_378,(ProString *)local_78);
        QString::append((QString *)local_348);
        if (local_378 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_378)->d).d = *(int *)&(((QString *)local_378)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_378)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_378,2,0x10);
          }
        }
        auVar35 = local_78;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)auVar35)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        if (local_b8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_b8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
          }
        }
        QString::append((QString *)local_348);
        auStack_70._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        pQStack_50 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
        auStack_70._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        auStack_70._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        auStack_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        pQVar3 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
        local_378 = (undefined1  [8])anon_var_dwarf_2c3199;
        pQStack_370 = (QMakeEvaluator *)iVar21.i;
        ProString::ProString<char_const(&)[16],ProString_const&>
                  ((ProString *)local_b8,
                   (QStringBuilder<const_char_(&)[16],_const_ProString_&> *)local_378);
        QMakeEvaluator::first((ProString *)local_78,pQVar3,(ProKey *)local_b8);
        if (local_b8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_b8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
          }
        }
        if (auStack_70._20_4_ != 0) {
          local_378 = (undefined1  [8])local_348;
          local_368 = (QMakeEvaluator *)local_2e8;
          pQStack_370 = (QMakeEvaluator *)local_78;
          MakefileGenerator::escapeFilePath<QStringBuilder<QString&,ProString&>,QString&>
                    ((QString *)local_b8,&pUVar75->super_MakefileGenerator,
                     (QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&> *)local_378)
          ;
          QVar59.m_data = (char *)0x13;
          QVar59.m_size = (qsizetype)local_318;
          QString::replace(QVar59,(QString *)"${QMAKE_PCH_OUTPUT}",
                           (CaseSensitivity)(ProString *)local_b8);
          iVar21.i = (ProString *)pQVar36;
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_b8)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
              iVar21.i = (ProString *)pQVar36;
            }
          }
          local_368 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
          local_378 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          pQStack_370 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
          pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
          ProKey::ProKey((ProKey *)local_b8,"QMAKE_PCH_ARCHS");
          pPVar25 = QMakeEvaluator::valuesRef(pQVar30,(ProKey *)local_b8);
          local_378 = (undefined1  [8])(pPVar25->super_QList<ProString>).d.d;
          pQStack_370 = (QMakeEvaluator *)(pPVar25->super_QList<ProString>).d.ptr;
          local_368 = (QMakeEvaluator *)(pPVar25->super_QList<ProString>).d.size;
          if (local_378 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)&((QMakeEvaluator *)local_378)->m_caller)->d).d =
                 *(int *)&(((QString *)&((QMakeEvaluator *)local_378)->m_caller)->d).d + 1;
            UNLOCK();
          }
          pQVar30 = pQVar28;
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)local_b8)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
              pQVar30 = pQVar28;
            }
          }
          if (local_368 != (QMakeEvaluator *)0x0) {
            lVar32 = (long)local_368 * 0x30;
            pQVar28 = pQStack_370;
            do {
              pQStack_3c8 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
              local_3d8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
              pQStack_3d0 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
              local_b8 = (undefined1  [8])local_348;
              local_a8.d.ptr =
                   (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                    )local_2e8;
              pQStack_b0 = (QMakeEvaluator *)local_78;
              QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&>::convertTo<QString>
                        ((QString *)local_3d8,
                         (QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&> *)
                         local_b8);
              ProString::toQString((QString *)local_b8,(ProString *)pQVar28);
              QVar60.m_data = (char *)0x11;
              QVar60.m_size = (qsizetype)local_3d8;
              QString::replace(QVar60,(QString *)"${QMAKE_PCH_ARCH}",
                               (CaseSensitivity)
                               (QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&> *)
                               local_b8);
              auVar35 = local_b8;
              if (local_b8 != (undefined1  [8])0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_b8)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_b8)->_q_value).super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)auVar35)->_q_value).super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
                }
              }
              pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
              QVar61.m_data = (storage_type *)0xf;
              QVar61.m_size = (qsizetype)local_b8;
              QString::fromUtf8(QVar61);
              auVar35 = local_b8;
              config_09.m_data = (storage_type_conflict *)pQStack_b0;
              config_09.m_size = (qsizetype)local_a8.d.ptr;
              bVar8 = QMakeEvaluator::isActiveConfig(pQVar36,config_09,false);
              if (bVar8) {
                QVar62.m_data = (char *)0x4;
                QVar62.m_size = (qsizetype)local_3d8;
                cVar11 = QString::endsWith(QVar62,0x2ade08);
                if (cVar11 == '\0') {
                  QVar63.m_data = (char *)0x4;
                  QVar63.m_size = (qsizetype)local_3d8;
                  cVar11 = QString::endsWith(QVar63,0x2aa41f);
                  if (auVar35 != (undefined1  [8])0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)auVar35)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)auVar35)->_q_value).super___atomic_base<int>._M_i + -1
                    ;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)auVar35)->_q_value).super___atomic_base<int>._M_i == 0)
                    {
                      QArrayData::deallocate((QArrayData *)auVar35,2,0x10);
                    }
                  }
                  if (cVar11 == '\0') goto LAB_001aa2e1;
                }
                else if (auVar35 != (undefined1  [8])0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)auVar35)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)auVar35)->_q_value).super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)auVar35)->_q_value).super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate((QArrayData *)auVar35,2,0x10);
                  }
                }
                QString::chop((longlong)local_3d8);
              }
              else if (auVar35 != (undefined1  [8])0x0) {
                LOCK();
                (((QBasicAtomicInt *)auVar35)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)auVar35)->_q_value).super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)auVar35)->_q_value).super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate((QArrayData *)auVar35,2,0x10);
                }
              }
LAB_001aa2e1:
              local_b8 = (undefined1  [8])0x13;
              pQStack_b0 = (QMakeEvaluator *)0x2aa3eb;
              pQStack_a0 = (QMakeEvaluator *)CONCAT71(pQStack_a0._1_7_,0x7d);
              local_a8.d.ptr =
                   (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                    )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                      )pQVar28;
              QStringBuilder<QStringBuilder<QLatin1String,_const_ProString_&>,_QLatin1Char>::
              convertTo<QString>(&local_408.m_string,
                                 (QStringBuilder<QStringBuilder<QLatin1String,_const_ProString_&>,_QLatin1Char>
                                  *)local_b8);
              (*(pUVar75->super_MakefileGenerator).super_QMakeSourceFileInfo.
                _vptr_QMakeSourceFileInfo[0xc])(&local_438,pUVar75,(QString *)local_3d8);
              QString::replace((QString *)local_318,(QString *)&local_408,
                               (CaseSensitivity)&local_438);
              if (&(local_438.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0)
              {
                LOCK();
                ((local_438.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((local_438.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_438.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate
                            (&(local_438.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QMakeEvaluator *)local_408.m_string.d.d != (QMakeEvaluator *)0x0) {
                LOCK();
                *(int *)&(((QString *)&(local_408.m_string.d.d)->super_QArrayData)->d).d =
                     *(int *)&(((QString *)&(local_408.m_string.d.d)->super_QArrayData)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)&(local_408.m_string.d.d)->super_QArrayData)->d).d == 0) {
                  QArrayData::deallocate(&(local_408.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (local_3d8 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&(((QString *)local_3d8)->d).d = *(int *)&(((QString *)local_3d8)->d).d + -1
                ;
                UNLOCK();
                if (*(int *)&(((QString *)local_3d8)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_3d8,2,0x10);
                }
              }
              pQVar28 = (QMakeEvaluator *)
                        &(pQVar28->m_locationStack).super_QList<QMakeEvaluator::Location>.d.size;
              lVar32 = lVar32 + -0x30;
            } while (lVar32 != 0);
          }
          QArrayDataPointer<ProString>::~QArrayDataPointer
                    ((QArrayDataPointer<ProString> *)local_378);
          pQVar28 = pQVar30;
          pQVar36 = (QMakeEvaluator *)iVar21.i;
        }
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_78)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        if (local_2e8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_2e8)->d).d = *(int *)&(((QString *)local_2e8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_2e8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_2e8,2,0x10);
          }
        }
      }
      if (local_308 != (QMakeEvaluator *)0x0) {
        local_78 = (undefined1  [8])0x2adf3e;
        auStack_70._0_8_ = local_318;
        ::operator+=((QString *)&local_3a8,(QStringBuilder<const_char_(&)[2],_QString_&> *)local_78)
        ;
      }
      if (local_348 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_348)->d).d = *(int *)&(((QString *)local_348)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_348)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_348,2,0x10);
        }
      }
      if (local_318 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_318)->d).d = *(int *)&(((QString *)local_318)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_318)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_318,2,0x10);
        }
      }
    }
    local_3d8 = (undefined1  [8])0x0;
    pQStack_3d0 = (QMakeEvaluator *)0x0;
    pQStack_3c8 = (QMakeEvaluator *)0x0;
    bVar8 = ProString::operator==(iVar21.i,"C");
    if ((bVar8) || (bVar8 = ProString::operator==(iVar21.i,"OBJC"), bVar8)) {
      QVar64.m_size = (size_t)"$(CC)";
      QVar64.field_0.m_data = local_3d8;
      QString::assign(QVar64);
      uVar29 = 10;
      pcVar33 = " $(CFLAGS)";
    }
    else {
      QVar65.m_size = (size_t)"$(CXX)";
      QVar65.field_0.m_data = local_3d8;
      QString::assign(QVar65);
      uVar29 = 0xc;
      pcVar33 = " $(CXXFLAGS)";
    }
    QString::append(&local_3a8,pcVar33,uVar29);
    QString::append(&local_3a8," $(INCPATH)",0xb);
    pQStack_98 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
    local_90 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
          )&DAT_aaaaaaaaaaaaaaaa;
    pQStack_a0 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    pQStack_b0 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
    ProString::ProString((ProString *)local_b8,iVar21.i);
    bVar8 = ProString::operator==((ProString *)local_b8,"C");
    if (bVar8) {
      ProString::ProString((ProString *)local_78,"CC");
      QString::operator=((QString *)local_b8,(QString *)local_78);
      auVar35 = local_78;
      local_90 = pQStack_50;
      pQStack_a0 = (QMakeEvaluator *)auStack_70._16_8_;
      pQStack_98 = (QMakeEvaluator *)auStack_70._24_8_;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)auVar35)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
    }
    local_2c8.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
          )&DAT_aaaaaaaaaaaaaaaa;
    pLStack_2c0 = (Location *)&DAT_aaaaaaaaaaaaaaaa;
    local_2d8 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_2d0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_2e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    pQStack_2e0 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = (undefined1  [8])0x2a8a61;
    auStack_70._0_8_ = (ProString *)local_b8;
    ProString::ProString<char_const(&)[11],ProString&>
              ((ProString *)local_2e8,(QStringBuilder<const_char_(&)[11],_ProString_&> *)local_78);
    bVar8 = QMakeProject::isEmpty
                      ((QMakeProject *)(((QString *)&pQVar30->m_caller)->d).d,(ProKey *)local_2e8);
    if (bVar8) {
      pUVar74 = pUVar75;
      pQVar16 = &QMakeEvaluator::valuesRef
                           (&((pUVar75->super_MakefileGenerator).project)->super_QMakeEvaluator,
                            (ProKey *)local_2e8)->super_QList<ProString>;
      ProKey::ProKey((ProKey *)local_348,"QMAKE_CC_O_FLAG");
      (*(pUVar75->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16]
      )(local_378,pUVar75,(ProKey *)local_348);
      local_48 = local_368;
      pQStack_50 = pQStack_370;
      auStack_70._24_8_ = local_378;
      local_368 = (QMakeEvaluator *)0x0;
      local_78 = (undefined1  [8])local_3d8;
      auStack_70._0_8_ = " ";
      auStack_70._16_8_ = " ";
      local_378 = (undefined1  [8])0x0;
      pQStack_370 = (QMakeEvaluator *)0x0;
      local_40 = (QMakeVfs *)0x2aa455;
      auStack_70._8_8_ = &local_3a8;
      ProString::
      ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString&,char_const(&)[2]>,QString&>,char_const(&)[2]>,QString>,char_const(&)[10]>
                ((ProString *)local_318,
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>,_const_char_(&)[10]>
                  *)local_78);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)local_318);
      QList<ProString>::end(pQVar16);
      pQVar30 = pQVar28;
      pUVar75 = pUVar74;
      if (local_318 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_318)->d).d = *(int *)&(((QString *)local_318)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_318)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_318,2,0x10);
          pQVar30 = pQVar28;
          pUVar75 = pUVar74;
        }
      }
      if ((QMakeEvaluator *)auStack_70._24_8_ != (QMakeEvaluator *)0x0) {
        LOCK();
        *(int *)&(((QString *)auStack_70._24_8_)->d).d =
             *(int *)&(((QString *)auStack_70._24_8_)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)auStack_70._24_8_)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)auStack_70._24_8_,2,0x10);
        }
      }
      pQVar28 = pQVar30;
      if (local_378 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_378)->d).d = *(int *)&(((QString *)local_378)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_378)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_378,2,0x10);
        }
      }
      if (local_348 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_348)->d).d = *(int *)&(((QString *)local_348)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_348)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_348,2,0x10);
        }
      }
    }
    auStack_70._0_8_ = local_b8;
    local_2f8.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
          )&DAT_aaaaaaaaaaaaaaaa;
    pLStack_2f0 = (Location *)&DAT_aaaaaaaaaaaaaaaa;
    local_308 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_300 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_318 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    pQStack_310 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = (undefined1  [8])0x2a8a61;
    auStack_70._8_8_ = (long)"QMAKE_RUN_CC_IMP" + 0xc;
    ProString::ProString<QStringBuilder<char_const(&)[11],ProString&>,char_const(&)[5]>
              ((ProString *)local_318,
               (QStringBuilder<QStringBuilder<const_char_(&)[11],_ProString_&>,_const_char_(&)[5]> *
               )local_78);
    bVar8 = QMakeProject::isEmpty
                      ((QMakeProject *)(((QString *)&pQVar30->m_caller)->d).d,(ProKey *)local_318);
    if (bVar8) {
      pUVar74 = pUVar75;
      pQVar16 = &QMakeEvaluator::valuesRef
                           (&((pUVar75->super_MakefileGenerator).project)->super_QMakeEvaluator,
                            (ProKey *)local_318)->super_QList<ProString>;
      ProKey::ProKey((ProKey *)local_378,"QMAKE_CC_O_FLAG");
      (*(pUVar75->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16]
      )(&local_408,pUVar75,(ProKey *)local_378);
      local_48 = (QMakeEvaluator *)local_408.m_string.d.size;
      pQStack_50 = (QMakeEvaluator *)local_408.m_string.d.ptr;
      auStack_70._24_8_ = local_408.m_string.d.d;
      local_408.m_string.d.size = 0;
      local_78 = (undefined1  [8])local_3d8;
      auStack_70._0_8_ = " ";
      auStack_70._16_8_ = " ";
      local_408.m_string.d.d = (Data *)0x0;
      local_408.m_string.d.ptr = (char16_t *)0x0;
      local_40 = (QMakeVfs *)0x2aa45f;
      auStack_70._8_8_ = &local_3a8;
      ProString::
      ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString&,char_const(&)[2]>,QString&>,char_const(&)[2]>,QString>,char_const(&)[10]>
                ((ProString *)local_348,
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>,_const_char_(&)[10]>
                  *)local_78);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)local_348);
      QList<ProString>::end(pQVar16);
      pQVar30 = pQVar28;
      pUVar75 = pUVar74;
      if (local_348 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_348)->d).d = *(int *)&(((QString *)local_348)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_348)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_348,2,0x10);
          pQVar30 = pQVar28;
          pUVar75 = pUVar74;
        }
      }
      uVar29 = auStack_70._24_8_;
      if ((QMakeEvaluator *)auStack_70._24_8_ != (QMakeEvaluator *)0x0) {
        LOCK();
        *(int *)&(((ProString *)auStack_70._24_8_)->m_string).d.d =
             *(int *)&(((ProString *)auStack_70._24_8_)->m_string).d.d + -1;
        UNLOCK();
        if (*(int *)&(((ProString *)uVar29)->m_string).d.d == 0) {
          QArrayData::deallocate((QArrayData *)auStack_70._24_8_,2,0x10);
        }
      }
      pQVar28 = pQVar30;
      if ((QMakeEvaluator *)local_408.m_string.d.d != (QMakeEvaluator *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_408.m_string.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_408.m_string.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_408.m_string.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_408.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_378 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_378)->d).d = *(int *)&(((QString *)local_378)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_378)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_378,2,0x10);
        }
      }
    }
    if (local_318 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_318)->d).d = *(int *)&(((QString *)local_318)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_318)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_318,2,0x10);
      }
    }
    if (local_2e8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_2e8)->d).d = *(int *)&(((QString *)local_2e8)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_2e8)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_2e8,2,0x10);
      }
    }
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_b8)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    if (local_3d8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_3d8)->d).d = *(int *)&(((QString *)local_3d8)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_3d8)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_3d8,2,0x10);
      }
    }
    if ((QMakeEvaluator *)local_3a8.super_ProString.m_string.d.d != (QMakeEvaluator *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_3a8.super_ProString.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_3a8.super_ProString.m_string.d.d)->super_QArrayData)->d).d
           + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_3a8.super_ProString.m_string.d.d)->super_QArrayData)->d).d
          == 0) {
        QArrayData::deallocate(&(local_3a8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    iVar21.i = (ProString *)&(pQVar36->m_locationStack).super_QList<QMakeEvaluator::Location>.d.size
    ;
  }
  pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
  auVar35 = (undefined1  [8])local_78;
  QVar66.m_data = (storage_type *)0x3;
  QVar66.m_size = (qsizetype)auVar35;
  QString::fromUtf8(QVar66);
  config_10.m_data = (storage_type_conflict *)auStack_70._0_8_;
  config_10.m_size = auStack_70._8_8_;
  auVar37 = local_78;
  bVar9 = QMakeEvaluator::isActiveConfig(pQVar36,config_10,false);
  bVar8 = true;
  if (bVar9) {
    pQVar31 = (QMakeProject *)(((QString *)&pQVar30->m_caller)->d).d;
    auVar35 = (undefined1  [8])local_2e8;
    ProKey::ProKey((ProKey *)auVar35,"TARGET");
    bVar10 = QMakeProject::isEmpty(pQVar31,(ProKey *)auVar35);
    if (bVar10) goto LAB_001aab9a;
    pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar30->m_caller)->d).d;
    QVar68.m_data = (storage_type *)0xa;
    QVar68.m_size = (qsizetype)local_78;
    QString::fromUtf8(QVar68);
    auVar35 = local_78;
    bVar8 = false;
    config_12.m_data = (storage_type_conflict *)auStack_70._0_8_;
    config_12.m_size = auStack_70._8_8_;
    bVar10 = QMakeEvaluator::isActiveConfig(pQVar36,config_12,false);
    if (bVar10) {
      bVar13 = true;
      bVar10 = false;
    }
    else {
      pQVar31 = (QMakeProject *)(((QString *)&pQVar30->m_caller)->d).d;
      ProKey::ProKey((ProKey *)local_318,"BUILDS");
      bVar13 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_318);
      bVar10 = true;
      bVar8 = false;
    }
  }
  else {
LAB_001aab9a:
    bVar10 = false;
    bVar13 = false;
  }
  if ((bVar10) && (local_318 != (undefined1  [8])0x0)) {
    LOCK();
    *(int *)&(((QString *)local_318)->d).d = *(int *)&(((QString *)local_318)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_318)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_318,2,0x10);
    }
  }
  if (!bVar8 && auVar35 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d =
         *(int *)&(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&((QMakeEvaluator *)auVar35)->m_caller)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)auVar35,2,0x10);
    }
  }
  pQVar30 = pQVar28;
  if ((bVar9) && (local_2e8 != (undefined1  [8])0x0)) {
    LOCK();
    *(int *)&(((QString *)local_2e8)->d).d = *(int *)&(((QString *)local_2e8)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_2e8)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_2e8,2,0x10);
    }
  }
  if (auVar37 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)&((QMakeEvaluator *)auVar37)->m_caller)->d).d =
         *(int *)&(((QString *)&((QMakeEvaluator *)auVar37)->m_caller)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)&((QMakeEvaluator *)auVar37)->m_caller)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)auVar37,2,0x10);
    }
  }
  if (bVar13 == false) {
    pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE");
    pQVar16 = &QMakeEvaluator::valuesRef(pQVar30,(ProKey *)local_78)->super_QList<ProString>;
    QList<ProString>::clear(pQVar16);
    auVar35 = local_78;
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)auVar35)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_LOCATION");
    pQVar16 = &QMakeEvaluator::valuesRef(pQVar30,(ProKey *)local_78)->super_QList<ProString>;
    QList<ProString>::clear(pQVar16);
    auVar35 = local_78;
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
      iVar15 = *(int *)&(((QString *)auVar35)->d).d;
      UNLOCK();
      auVar35 = local_78;
      goto joined_r0x001aaf64;
    }
  }
  else {
    local_328.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
          )&DAT_aaaaaaaaaaaaaaaa;
    pQStack_320 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
    local_338 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
    uStack_330 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
    local_348 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    pQStack_340 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
    ProString::ProString((ProString *)local_348);
    pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
    QVar67.m_data = (storage_type *)0x6;
    QVar67.m_size = (qsizetype)local_78;
    QString::fromUtf8(QVar67);
    auVar35 = local_78;
    bVar8 = false;
    config_11.m_data = (storage_type_conflict *)auStack_70._0_8_;
    config_11.m_size = auStack_70._8_8_;
    bVar9 = QMakeEvaluator::isActiveConfig(pQVar28,config_11,false);
    if (bVar9) {
      pQVar31 = (QMakeProject *)(((QString *)&pQVar30->m_caller)->d).d;
      ProKey::ProKey((ProKey *)local_378,"QMAKE_BUNDLE_EXTENSION");
      bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_378);
      bVar8 = !bVar8;
      if (local_378 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_378)->d).d = *(int *)&(((QString *)local_378)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)local_378)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_378,2,0x10);
        }
      }
    }
    pQVar28 = pQVar30;
    if (auVar35 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)auVar35)->d).d = *(int *)&(((QString *)auVar35)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)auVar35)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)auVar35,2,0x10);
        pQVar28 = pQVar30;
      }
    }
    if (bVar8) {
      pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
      ProKey::ProKey((ProKey *)local_b8,"TARGET");
      QMakeEvaluator::first((ProString *)local_78,pQVar30,(ProKey *)local_b8);
      QString::operator=((QString *)local_348,(QString *)local_78);
      auVar35 = local_78;
      uStack_330 = (QMakeEvaluator *)auStack_70._16_8_;
      local_328.d.d.ptr =
           (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
            )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
              )auStack_70._24_8_;
      pQStack_320 = pQStack_50;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)auVar35)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      auVar35 = local_b8;
      if (local_b8 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)auVar35)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
        }
      }
      pQVar31 = (QMakeProject *)(((QString *)&pQVar28->m_caller)->d).d;
      ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_NAME");
      bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
      auVar35 = local_78;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)auVar35)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      if (!bVar8) {
        pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
        ProKey::ProKey((ProKey *)local_b8,"QMAKE_BUNDLE_NAME");
        QMakeEvaluator::first((ProString *)local_78,pQVar30,(ProKey *)local_b8);
        QString::operator=((QString *)local_348,(QString *)local_78);
        auVar35 = local_78;
        pQStack_320 = pQStack_50;
        uStack_330 = (QMakeEvaluator *)auStack_70._16_8_;
        local_328.d.d.ptr =
             (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
              )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                )auStack_70._24_8_;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)auVar35)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        auVar35 = local_b8;
        if (local_b8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
          iVar15 = *(int *)&(((QString *)auVar35)->d).d;
          UNLOCK();
          auVar35 = local_b8;
joined_r0x001abe9a:
          if (iVar15 == 0) {
            QArrayData::deallocate((QArrayData *)auVar35,2,0x10);
          }
        }
      }
LAB_001abea9:
      pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
      ProKey::ProKey((ProKey *)local_b8,"QMAKE_BUNDLE_EXTENSION");
      QMakeEvaluator::first((ProString *)local_78,pQVar30,(ProKey *)local_b8);
      bVar8 = ProString::endsWith((ProString *)local_348,(ProString *)local_78,CaseSensitive);
      auVar35 = local_78;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)auVar35)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      auVar35 = local_b8;
      if (local_b8 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)auVar35)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
        }
      }
      if (!bVar8) {
        pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
        ProKey::ProKey((ProKey *)local_b8,"QMAKE_BUNDLE_EXTENSION");
        QMakeEvaluator::first((ProString *)local_78,pQVar30,(ProKey *)local_b8);
        ProString::append((ProString *)local_348,(ProString *)local_78,(bool *)0x0);
        auVar35 = local_78;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)auVar35)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        auVar35 = local_b8;
        if (local_b8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
          iVar15 = *(int *)&(((QString *)auVar35)->d).d;
          UNLOCK();
          auVar35 = local_b8;
joined_r0x001abcbf:
          if (iVar15 == 0) {
            QArrayData::deallocate((QArrayData *)auVar35,2,0x10);
          }
        }
      }
    }
    else {
      pQVar3 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
      pQVar30 = (QMakeEvaluator *)local_b8;
      pQVar36 = pQVar28;
      ProKey::ProKey((ProKey *)pQVar30,"TEMPLATE");
      QMakeEvaluator::first((ProString *)local_78,pQVar3,(ProKey *)pQVar30);
      bVar8 = ProString::operator==((ProString *)local_78,"app");
      if (bVar8) {
        pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
        QVar69.m_data = (storage_type *)0xa;
        QVar69.m_size = (qsizetype)&local_3a8;
        QString::fromUtf8(QVar69);
        pQVar30 = (QMakeEvaluator *)local_3a8.super_ProString.m_string.d.d;
        config_13.m_data = local_3a8.super_ProString.m_string.d.ptr;
        config_13.m_size = local_3a8.super_ProString.m_string.d.size;
        bVar9 = QMakeEvaluator::isActiveConfig(pQVar28,config_13,false);
      }
      else {
        bVar9 = false;
      }
      if (bVar8 && pQVar30 != (QMakeEvaluator *)0x0) {
        LOCK();
        *(int *)&(((QString *)&pQVar30->m_caller)->d).d =
             *(int *)&(((QString *)&pQVar30->m_caller)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&pQVar30->m_caller)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)pQVar30,2,0x10);
        }
      }
      auVar35 = local_78;
      pQVar28 = pQVar36;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)auVar35)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      auVar35 = local_b8;
      if (local_b8 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)auVar35)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
        }
      }
      if (bVar9 == false) {
        pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar36->m_caller)->d).d;
        ProKey::ProKey((ProKey *)local_b8,"TEMPLATE");
        QMakeEvaluator::first((ProString *)local_78,pQVar30,(ProKey *)local_b8);
        bVar9 = ProString::operator==((ProString *)local_78,"lib");
        bVar8 = true;
        if (bVar9) {
          pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar36->m_caller)->d).d;
          QVar70.m_data = (storage_type *)0x9;
          QVar70.m_size = (qsizetype)&local_3a8;
          QString::fromUtf8(QVar70);
          config_14.m_data = local_3a8.super_ProString.m_string.d.ptr;
          config_14.m_size = local_3a8.super_ProString.m_string.d.size;
          auVar37 = (undefined1  [8])local_3a8.super_ProString.m_string.d.d;
          bVar10 = QMakeEvaluator::isActiveConfig(pQVar30,config_14,false);
          if (bVar10) goto LAB_001ab699;
          pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar36->m_caller)->d).d;
          QVar71.m_data = (storage_type *)0x6;
          QVar71.m_size = (qsizetype)&local_3a8;
          QString::fromUtf8(QVar71);
          local_440 = (QMakeEvaluator *)local_3a8.super_ProString.m_string.d.d;
          config_15.m_data = local_3a8.super_ProString.m_string.d.ptr;
          config_15.m_size = local_3a8.super_ProString.m_string.d.size;
          bVar13 = QMakeEvaluator::isActiveConfig(pQVar30,config_15,false);
          if (bVar13) {
LAB_001ac336:
            pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
            bVar13 = !bVar13;
            QVar73.m_data = (storage_type *)0x6;
            QVar73.m_size = (qsizetype)&local_3a8;
            QString::fromUtf8(QVar73);
            pQVar36 = (QMakeEvaluator *)local_3a8.super_ProString.m_string.d.d;
            bVar8 = false;
            config_18.m_data = local_3a8.super_ProString.m_string.d.ptr;
            config_18.m_size = local_3a8.super_ProString.m_string.d.size;
            bVar10 = QMakeEvaluator::isActiveConfig(pQVar30,config_18,false);
            if (bVar10) {
              pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
              QString::QString((QString *)&local_3a8,"plugin_bundle");
              bVar8 = false;
              config_19.m_data = local_3a8.super_ProString.m_string.d.ptr;
              config_19.m_size = local_3a8.super_ProString.m_string.d.size;
              bVar14 = QMakeEvaluator::isActiveConfig(pQVar30,config_19,false);
              bVar5 = true;
              bVar10 = false;
              goto LAB_001ab6a1;
            }
            bVar10 = false;
            goto LAB_001ab69c;
          }
          pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
          pQVar36 = (QMakeEvaluator *)local_3d8;
          QString::QString((QString *)pQVar36,"lib_bundle");
          bVar8 = false;
          config_16.m_data = (storage_type_conflict *)pQStack_3d0;
          config_16.m_size = (qsizetype)pQStack_3c8;
          bVar10 = QMakeEvaluator::isActiveConfig(pQVar30,config_16,false);
          if (!bVar10) goto LAB_001ac336;
          bVar13 = true;
          bVar10 = true;
          bVar5 = false;
          bVar14 = true;
        }
        else {
LAB_001ab699:
          bVar13 = false;
          bVar10 = true;
LAB_001ab69c:
          bVar5 = false;
          bVar14 = false;
        }
LAB_001ab6a1:
        if ((bVar5) &&
           ((QMakeEvaluator *)local_3a8.super_ProString.m_string.d.d != (QMakeEvaluator *)0x0)) {
          LOCK();
          *(int *)&(((QString *)&(local_3a8.super_ProString.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_3a8.super_ProString.m_string.d.d)->super_QArrayData)->d
                        ).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_3a8.super_ProString.m_string.d.d)->super_QArrayData)->d)
                       .d == 0) {
            QArrayData::deallocate
                      (&(local_3a8.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (!bVar10 && pQVar36 != (QMakeEvaluator *)0x0) {
          LOCK();
          *(int *)&(((QString *)&pQVar36->m_caller)->d).d =
               *(int *)&(((QString *)&pQVar36->m_caller)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&pQVar36->m_caller)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)pQVar36,2,0x10);
          }
        }
        pQVar30 = pQVar28;
        if ((bVar13) && (local_3d8 != (undefined1  [8])0x0)) {
          LOCK();
          *(int *)&(((QString *)local_3d8)->d).d = *(int *)&(((QString *)local_3d8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_3d8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_3d8,2,0x10);
          }
        }
        if (!bVar8 && local_440 != (QMakeEvaluator *)0x0) {
          LOCK();
          *(int *)&(((QString *)&local_440->m_caller)->d).d =
               *(int *)&(((QString *)&local_440->m_caller)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&local_440->m_caller)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_440,2,0x10);
          }
        }
        if (bVar9 && auVar37 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)&((QMakeEvaluator *)auVar37)->m_caller)->d).d =
               *(int *)&(((QString *)&((QMakeEvaluator *)auVar37)->m_caller)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&((QMakeEvaluator *)auVar37)->m_caller)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)auVar37,2,0x10);
          }
        }
        auVar35 = local_78;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)auVar35)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        auVar35 = local_b8;
        if (local_b8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)auVar35)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
          }
        }
        if (bVar14 != false) {
          pQVar36 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
          ProKey::ProKey((ProKey *)local_b8,"TARGET");
          QMakeEvaluator::first((ProString *)local_78,pQVar36,(ProKey *)local_b8);
          QString::operator=((QString *)local_348,(QString *)local_78);
          auVar35 = local_78;
          uStack_330 = (QMakeEvaluator *)auStack_70._16_8_;
          local_328.d.d.ptr =
               (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                  )auStack_70._24_8_;
          pQStack_320 = pQStack_50;
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)auVar35)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          auVar35 = local_b8;
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)auVar35)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
          pQVar28 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
          QVar72.m_data = (storage_type *)0x6;
          QVar72.m_size = (qsizetype)local_78;
          QString::fromUtf8(QVar72);
          auVar35 = local_78;
          config_17.m_data = (storage_type_conflict *)auStack_70._0_8_;
          config_17.m_size = auStack_70._8_8_;
          bVar8 = QMakeEvaluator::isActiveConfig(pQVar28,config_17,false);
          pQVar28 = pQVar30;
          if (auVar35 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)auVar35)->d).d = *(int *)&(((QString *)auVar35)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)auVar35)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)auVar35,2,0x10);
              pQVar28 = pQVar30;
            }
          }
          pQVar31 = (QMakeProject *)(((QString *)&pQVar28->m_caller)->d).d;
          if (!bVar8) {
            ProKey::ProKey((ProKey *)local_78,"QMAKE_FRAMEWORK_BUNDLE_NAME");
            bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
            auVar35 = local_78;
            if (local_78 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)auVar35)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_78,2,0x10);
              }
            }
            if (!bVar8) {
              pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
              ProKey::ProKey((ProKey *)local_b8,"QMAKE_FRAMEWORK_BUNDLE_NAME");
              QMakeEvaluator::first((ProString *)local_78,pQVar30,(ProKey *)local_b8);
              QString::operator=((QString *)local_348,(QString *)local_78);
              auVar35 = local_78;
              pQStack_320 = pQStack_50;
              uStack_330 = (QMakeEvaluator *)auStack_70._16_8_;
              local_328.d.d.ptr =
                   (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                    )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                      )auStack_70._24_8_;
              if (local_78 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)auVar35)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_78,2,0x10);
                }
              }
              auVar35 = local_b8;
              if (local_b8 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)auVar35)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
                }
              }
            }
            pQVar31 = (QMakeProject *)(((QString *)&pQVar28->m_caller)->d).d;
            ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_EXTENSION");
            bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
            auVar35 = local_78;
            if (local_78 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)auVar35)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_78,2,0x10);
              }
            }
            if (bVar8) {
              pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
              ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_EXTENSION");
              pQVar16 = &QMakeEvaluator::valuesRef(pQVar30,(ProKey *)local_78)->
                         super_QList<ProString>;
              ProString::ProString((ProString *)local_b8,".framework");
              QList<ProString>::append(pQVar16,(ProString *)local_b8);
              auVar35 = local_b8;
              if (local_b8 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)auVar35)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
                }
              }
              auVar35 = local_78;
              if (local_78 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
                iVar15 = *(int *)&(((QString *)auVar35)->d).d;
                UNLOCK();
                auVar35 = local_78;
                goto joined_r0x001abe9a;
              }
            }
            goto LAB_001abea9;
          }
          ProKey::ProKey((ProKey *)local_78,"QMAKE_PLUGIN_BUNDLE_NAME");
          bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
          auVar35 = local_78;
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)auVar35)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          if (!bVar8) {
            pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
            ProKey::ProKey((ProKey *)local_b8,"QMAKE_PLUGIN_BUNDLE_NAME");
            QMakeEvaluator::first((ProString *)local_78,pQVar30,(ProKey *)local_b8);
            QString::operator=((QString *)local_348,(QString *)local_78);
            auVar35 = local_78;
            pQStack_320 = pQStack_50;
            uStack_330 = (QMakeEvaluator *)auStack_70._16_8_;
            local_328.d.d.ptr =
                 (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                  )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                    )auStack_70._24_8_;
            if (local_78 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)auVar35)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_78,2,0x10);
              }
            }
            auVar35 = local_b8;
            if (local_b8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)auVar35)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
              }
            }
          }
          pQVar31 = (QMakeProject *)(((QString *)&pQVar28->m_caller)->d).d;
          ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_EXTENSION");
          bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
          auVar35 = local_78;
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)auVar35)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          if (bVar8) {
            pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
            ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_EXTENSION");
            pQVar16 = &QMakeEvaluator::valuesRef(pQVar30,(ProKey *)local_78)->super_QList<ProString>
            ;
            ProString::ProString((ProString *)local_b8,".plugin");
            QList<ProString>::append(pQVar16,(ProString *)local_b8);
            auVar35 = local_b8;
            if (local_b8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)auVar35)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
              }
            }
            auVar35 = local_78;
            if (local_78 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)auVar35)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_78,2,0x10);
              }
            }
          }
          pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
          ProKey::ProKey((ProKey *)local_b8,"QMAKE_BUNDLE_EXTENSION");
          QMakeEvaluator::first((ProString *)local_78,pQVar30,(ProKey *)local_b8);
          bVar8 = ProString::endsWith((ProString *)local_348,(ProString *)local_78,CaseSensitive);
          auVar35 = local_78;
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)auVar35)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          auVar35 = local_b8;
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)auVar35)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
          if (!bVar8) {
            pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
            ProKey::ProKey((ProKey *)local_b8,"QMAKE_BUNDLE_EXTENSION");
            QMakeEvaluator::first((ProString *)local_78,pQVar30,(ProKey *)local_b8);
            ProString::append((ProString *)local_348,(ProString *)local_78,(bool *)0x0);
            auVar35 = local_78;
            if (local_78 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)auVar35)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_78,2,0x10);
              }
            }
            auVar35 = local_b8;
            if (local_b8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)auVar35)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
              }
            }
          }
          pQVar31 = (QMakeProject *)(((QString *)&pQVar28->m_caller)->d).d;
          ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_LOCATION");
          bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
          auVar35 = local_78;
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)auVar35)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          if (bVar8) {
            pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
            ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_LOCATION");
            pQVar16 = &QMakeEvaluator::valuesRef(pQVar30,(ProKey *)local_78)->super_QList<ProString>
            ;
            ProString::ProString((ProString *)local_b8,"Contents/MacOS");
            QList<ProString>::append(pQVar16,(ProString *)local_b8);
            auVar35 = local_b8;
            if (local_b8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)auVar35)->d).d == 0) {
                QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
              }
            }
            auVar35 = local_78;
            if (local_78 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
              iVar15 = *(int *)&(((QString *)auVar35)->d).d;
              UNLOCK();
              auVar35 = local_78;
              goto joined_r0x001abcbf;
            }
          }
        }
      }
      else {
        pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar36->m_caller)->d).d;
        ProKey::ProKey((ProKey *)local_b8,"TARGET");
        QMakeEvaluator::first((ProString *)local_78,pQVar30,(ProKey *)local_b8);
        QString::operator=((QString *)local_348,(QString *)local_78);
        auVar35 = local_78;
        uStack_330 = (QMakeEvaluator *)auStack_70._16_8_;
        local_328.d.d.ptr =
             (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
              )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                )auStack_70._24_8_;
        pQStack_320 = pQStack_50;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)auVar35)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        auVar35 = local_b8;
        if (local_b8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)auVar35)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
          }
        }
        pQVar31 = (QMakeProject *)(((QString *)&pQVar36->m_caller)->d).d;
        ProKey::ProKey((ProKey *)local_78,"QMAKE_APPLICATION_BUNDLE_NAME");
        bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
        auVar35 = local_78;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)auVar35)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        if (!bVar8) {
          pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar36->m_caller)->d).d;
          ProKey::ProKey((ProKey *)local_b8,"QMAKE_APPLICATION_BUNDLE_NAME");
          QMakeEvaluator::first((ProString *)local_78,pQVar30,(ProKey *)local_b8);
          QString::operator=((QString *)local_348,(QString *)local_78);
          auVar35 = local_78;
          pQStack_320 = pQStack_50;
          uStack_330 = (QMakeEvaluator *)auStack_70._16_8_;
          local_328.d.d.ptr =
               (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                  )auStack_70._24_8_;
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)auVar35)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          auVar35 = local_b8;
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)auVar35)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
        }
        bVar8 = ProString::endsWith((ProString *)local_348,".app",CaseSensitive);
        if (!bVar8) {
          other.m_data = ".app";
          other.m_size = 4;
          ProString::append((ProString *)local_348,other);
        }
        pQVar31 = (QMakeProject *)(((QString *)&pQVar36->m_caller)->d).d;
        ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_LOCATION");
        bVar8 = QMakeProject::isEmpty(pQVar31,(ProKey *)local_78);
        auVar35 = local_78;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)auVar35)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        if (bVar8) {
          pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
          ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_LOCATION");
          pQVar16 = &QMakeEvaluator::valuesRef(pQVar30,(ProKey *)local_78)->super_QList<ProString>;
          ProString::ProString((ProString *)local_b8,"Contents/MacOS");
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)local_b8)
          ;
          QList<ProString>::end(pQVar16);
          auVar35 = local_b8;
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)auVar35)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
          auVar35 = local_78;
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)auVar35)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
        }
        pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
        ProKey::ProKey(&local_3a8,"QMAKE_PKGINFO");
        pQVar16 = &QMakeEvaluator::valuesRef(pQVar30,&local_3a8)->super_QList<ProString>;
        pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
        ProKey::ProKey(&local_438,"DESTDIR");
        QMakeEvaluator::first(&local_408,pQVar30,&local_438);
        ProString::ProString((ProString *)local_b8,&local_408);
        local_88 = (QMakeEvaluator *)local_348;
        ProString::ProString((ProString *)local_78,(ProString *)local_b8);
        local_48 = local_88;
        local_40 = (QMakeVfs *)0x2aa49c;
        ProString::ProString<QStringBuilder<ProString,ProString&>,char_const(&)[18]>
                  ((ProString *)local_3d8,
                   (QStringBuilder<QStringBuilder<ProString,_ProString_&>,_const_char_(&)[18]> *)
                   local_78);
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                  ((QMovableArrayOps<ProString> *)pQVar16,(pQVar16->d).size,(ProString *)local_3d8);
        QList<ProString>::end(pQVar16);
        if (local_3d8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_3d8)->d).d = *(int *)&(((QString *)local_3d8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_3d8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_3d8,2,0x10);
          }
        }
        auVar35 = local_78;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)auVar35)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        auVar35 = local_b8;
        if (local_b8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)auVar35)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
          }
        }
        if ((QMakeEvaluator *)local_408.m_string.d.d != (QMakeEvaluator *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_408.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_408.m_string.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_408.m_string.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_408.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_438.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_438.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((local_438.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_438.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate
                      (&(local_438.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QMakeEvaluator *)local_3a8.super_ProString.m_string.d.d != (QMakeEvaluator *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_3a8.super_ProString.m_string.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_3a8.super_ProString.m_string.d.d)->super_QArrayData)->d
                        ).d + -1;
          iVar15 = *(int *)&(((QString *)&(local_3a8.super_ProString.m_string.d.d)->super_QArrayData
                             )->d).d;
          UNLOCK();
          auVar35 = (undefined1  [8])local_3a8.super_ProString.m_string.d.d;
          goto joined_r0x001abcbf;
        }
      }
    }
    if (uStack_330._4_4_ == 0) {
      pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
      ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE");
      pQVar16 = &QMakeEvaluator::valuesRef(pQVar30,(ProKey *)local_78)->super_QList<ProString>;
      QList<ProString>::clear(pQVar16);
      auVar35 = local_78;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)auVar35)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
      ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_LOCATION");
      pQVar16 = &QMakeEvaluator::valuesRef(pQVar30,(ProKey *)local_78)->super_QList<ProString>;
      QList<ProString>::clear(pQVar16);
      auVar35 = local_78;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)auVar35)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
    }
    else {
      local_408.m_string.d.d = (Data *)0x0;
      local_408.m_string.d.ptr = (char16_t *)0x0;
      local_408.m_string.d.size = 0;
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)&local_408,0,(ProString *)local_348);
      QList<ProString>::end((QList<ProString> *)&local_408);
      pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
      ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE");
      pPVar25 = QMakeEvaluator::valuesRef(pQVar30,(ProKey *)local_78);
      qVar24 = local_408.m_string.d.size;
      pcVar23 = local_408.m_string.d.ptr;
      pDVar1 = local_408.m_string.d.d;
      local_408.m_string.d.d = (Data *)0x0;
      local_408.m_string.d.ptr = (char16_t *)0x0;
      local_408.m_string.d.size = 0;
      local_b8 = (undefined1  [8])(pPVar25->super_QList<ProString>).d.d;
      pQStack_b0 = (QMakeEvaluator *)(pPVar25->super_QList<ProString>).d.ptr;
      (pPVar25->super_QList<ProString>).d.d = (Data *)pDVar1;
      (pPVar25->super_QList<ProString>).d.ptr = (ProString *)pcVar23;
      local_a8.d.ptr =
           (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
            )(pPVar25->super_QList<ProString>).d.size;
      (pPVar25->super_QList<ProString>).d.size = qVar24;
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_b8);
      auVar35 = local_78;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)auVar35)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_408);
    }
    if (local_348 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_348)->d).d = *(int *)&(((QString *)local_348)->d).d + -1;
      iVar15 = *(int *)&(((QString *)local_348)->d).d;
      UNLOCK();
      auVar35 = local_348;
joined_r0x001aaf64:
      if (iVar15 == 0) {
        QArrayData::deallocate((QArrayData *)auVar35,2,0x10);
      }
    }
  }
  init2(pUVar75);
  auStack_70._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QMakeEvaluator *)&DAT_aaaaaaaaaaaaaaaa;
  auStack_70._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  auStack_70._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  auStack_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar31 = (pUVar75->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_b8,"TARGET");
  QMakeEvaluator::first((ProString *)local_78,&pQVar31->super_QMakeEvaluator,(ProKey *)local_b8);
  auVar35 = local_b8;
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)auVar35)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  iVar15 = ProString::lastIndexOf((ProString *)local_78,&Option::dir_sep,-1,CaseSensitive);
  if (iVar15 != -1) {
    auStack_70._20_4_ = auStack_70._20_4_ - (iVar15 + 1);
    auStack_70._16_4_ = auStack_70._16_4_ + iVar15 + 1;
  }
  pQVar30 = (QMakeEvaluator *)(((QString *)&pQVar28->m_caller)->d).d;
  ProKey::ProKey((ProKey *)local_b8,"LIB_TARGET");
  this_00 = (QMovableArrayOps<ProString> *)QMakeEvaluator::valuesRef(pQVar30,(ProKey *)local_b8);
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>(this_00,0,(ProString *)local_78)
  ;
  auVar35 = local_b8;
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_b8)->d).d = *(int *)&(((QString *)local_b8)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)auVar35)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_78)->d).d = *(int *)&(((QString *)local_78)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_78)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)(local_250 + 8));
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_228);
LAB_001ac226:
  if (&(local_208.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_208.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_1e8);
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(Data **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void
UnixMakefileGenerator::init()
{
    ProStringList &configs = project->values("CONFIG");
    if(project->isEmpty("ICON") && !project->isEmpty("RC_FILE"))
        project->values("ICON") = project->values("RC_FILE");
    if(project->isEmpty("QMAKE_EXTENSION_PLUGIN"))
        project->values("QMAKE_EXTENSION_PLUGIN").append(project->first("QMAKE_EXTENSION_SHLIB"));

    project->values("QMAKE_ORIG_TARGET") = project->values("TARGET");

    //version handling
    if (project->isEmpty("VERSION")) {
        project->values("VERSION").append(
            "1.0." + (project->isEmpty("VER_PAT") ? QString("0") : project->first("VER_PAT")));
    }
    QStringList l = project->first("VERSION").toQString().split('.');
    l << "0" << "0"; //make sure there are three
    project->values("VER_MAJ").append(l[0]);
    project->values("VER_MIN").append(l[1]);
    project->values("VER_PAT").append(l[2]);

    QString sroot = project->sourceRoot();
    for (const ProString &iif : project->values("QMAKE_INTERNAL_INCLUDED_FILES")) {
        if (iif == project->cacheFile())
            continue;
        if (iif.startsWith(sroot) && iif.at(sroot.size()) == QLatin1Char('/'))
            project->values("DISTFILES") += fileFixify(iif.toQString(), FileFixifyRelative);
    }

    /* this should probably not be here, but I'm using it to wrap the .t files */
    if(project->first("TEMPLATE") == "app")
        project->values("QMAKE_APP_FLAG").append("1");
    else if(project->first("TEMPLATE") == "lib")
        project->values("QMAKE_LIB_FLAG").append("1");
    else if(project->first("TEMPLATE") == "subdirs") {
        MakefileGenerator::init();
        if(project->isEmpty("MAKEFILE"))
            project->values("MAKEFILE").append("Makefile");
        return; /* subdirs is done */
    }

    project->values("QMAKE_ORIG_DESTDIR") = project->values("DESTDIR");
    if((!project->isEmpty("QMAKE_LIB_FLAG") && !project->isActiveConfig("staticlib")) ||
       (project->isActiveConfig("qt") &&  project->isActiveConfig("plugin"))) {
        if(configs.indexOf("dll") == -1) configs.append("dll");
    } else if(!project->isEmpty("QMAKE_APP_FLAG") || project->isActiveConfig("dll")) {
        configs.removeAll("staticlib");
    }
    if(!project->isEmpty("QMAKE_INCREMENTAL"))
        project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_INCREMENTAL");
    else if(!project->isEmpty("QMAKE_LFLAGS_PREBIND") &&
            !project->values("QMAKE_LIB_FLAG").isEmpty() &&
            project->isActiveConfig("dll"))
        project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_PREBIND");
    project->values("QMAKE_INCDIR") += project->values("QMAKE_INCDIR_POST");
    project->values("QMAKE_RPATHDIR") += project->values("QMAKE_RPATHDIR_POST");
    project->values("QMAKE_RPATHLINKDIR") += project->values("QMAKE_RPATHLINKDIR_POST");
    if(!project->isEmpty("QMAKE_INCDIR"))
        project->values("INCLUDEPATH") += project->values("QMAKE_INCDIR");
    // The order of the next two lines is relevant due to side effect on QMAKE_LFLAGS.
    ProStringList ldadd = project->values("QMAKE_LIBDIR_FLAGS") + libdirToFlags("QMAKE_LIBDIR");
    ProStringList ldaddpost = libdirToFlags("QMAKE_LIBDIR_POST");
    if (project->isActiveConfig("mac")) {
        if (!project->isEmpty("QMAKE_FRAMEWORKPATH")) {
            const ProStringList &fwdirs = project->values("QMAKE_FRAMEWORKPATH");
            for (int i = 0; i < fwdirs.size(); ++i)
                project->values("QMAKE_FRAMEWORKPATH_FLAGS") += "-F" + escapeFilePath(fwdirs[i]);
        }
        ldadd += project->values("QMAKE_FRAMEWORKPATH_FLAGS");
    }
    ProStringList &qmklibs = project->values("LIBS");
    qmklibs = ldadd + qmklibs;
    ProStringList &qmklibspost = project->values("QMAKE_LIBS");
    qmklibspost = ldaddpost + qmklibspost;
    if (!project->isEmpty("QMAKE_RPATHDIR") && !project->isEmpty("QMAKE_LFLAGS_RPATH")) {
        const ProStringList &rpathdirs = project->values("QMAKE_RPATHDIR");
        for (int i = 0; i < rpathdirs.size(); ++i) {
            QString rpathdir = rpathdirs[i].toQString();
            if (rpathdir.size() > 1 && rpathdir.at(0) == '$' && rpathdir.at(1) != '(') {
                rpathdir.replace(0, 1, "\\$$");  // Escape from make and the shell
            } else if (!rpathdir.startsWith('@') && fileInfo(rpathdir).isRelative()) {
                QString rpathbase = project->first("QMAKE_REL_RPATH_BASE").toQString();
                if (rpathbase.isEmpty()) {
                    fprintf(stderr, "Error: This platform does not support relative paths in QMAKE_RPATHDIR (%s)\n",
                                    rpathdir.toLatin1().constData());
                    continue;
                }
                if (rpathbase.startsWith('$'))
                    rpathbase.replace(0, 1, "\\$$");  // Escape from make and the shell
                if (rpathdir == ".")
                    rpathdir = rpathbase;
                else
                    rpathdir.prepend(rpathbase + '/');
                project->values("QMAKE_LFLAGS").insertUnique(project->values("QMAKE_LFLAGS_REL_RPATH"));
            }
            project->values("QMAKE_LFLAGS") += var("QMAKE_LFLAGS_RPATH") + escapeFilePath(rpathdir);
        }
    }
    if (!project->isEmpty("QMAKE_RPATHLINKDIR")) {
        const ProStringList &rpathdirs = project->values("QMAKE_RPATHLINKDIR");
        for (int i = 0; i < rpathdirs.size(); ++i) {
            if (!project->isEmpty("QMAKE_LFLAGS_RPATHLINK"))
                project->values("QMAKE_LFLAGS") += var("QMAKE_LFLAGS_RPATHLINK") + escapeFilePath(QFileInfo(rpathdirs[i].toQString()).absoluteFilePath());
        }
    }

    if(project->isActiveConfig("GNUmake") && !project->isEmpty("QMAKE_CFLAGS_DEPS"))
        include_deps = true; //do not generate deps

    MakefileGenerator::init();

    if (project->isActiveConfig("objective_c"))
        project->values("QMAKE_BUILTIN_COMPILERS") << "OBJC" << "OBJCXX";

    for (const ProString &compiler : project->values("QMAKE_BUILTIN_COMPILERS")) {
        QString compile_flag = var("QMAKE_COMPILE_FLAG");
        if(compile_flag.isEmpty())
            compile_flag = "-c";

        if(doPrecompiledHeaders() && !project->isEmpty("PRECOMPILED_HEADER")) {
            QString pchFlags = var(ProKey("QMAKE_" + compiler + "FLAGS_USE_PRECOMPILE"));

            QString pchBaseName;
            if(!project->isEmpty("PRECOMPILED_DIR")) {
                pchBaseName = Option::fixPathToTargetOS(project->first("PRECOMPILED_DIR").toQString());
                if(!pchBaseName.endsWith(Option::dir_sep))
                    pchBaseName += Option::dir_sep;
            }
            pchBaseName += project->first("QMAKE_ORIG_TARGET").toQString();

            // replace place holders
            pchFlags.replace(QLatin1String("${QMAKE_PCH_INPUT}"),
                             escapeFilePath(project->first("PRECOMPILED_HEADER").toQString()));
            pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT_BASE}"), escapeFilePath(pchBaseName));
            if (project->isActiveConfig("icc_pch_style")) {
                // icc style
                pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT}"),
                                 escapeFilePath(pchBaseName + project->first("QMAKE_PCH_OUTPUT_EXT")));
                const ProStringList pchArchs = project->values("QMAKE_PCH_ARCHS");
                for (const ProString &arch : pchArchs) {
                    QString suffix = project->first("QMAKE_PCH_OUTPUT_EXT").toQString();
                    suffix.replace(QLatin1String("${QMAKE_PCH_ARCH}"), arch.toQString());
                    pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT_") + arch + QLatin1Char('}'),
                                     escapeFilePath(pchBaseName + suffix));
                }
            } else {
                // gcc style (including clang_pch_style)
                QString headerSuffix;
                if (project->isActiveConfig("clang_pch_style"))
                    headerSuffix = project->first("QMAKE_PCH_OUTPUT_EXT").toQString();

                pchBaseName += project->first("QMAKE_PCH_OUTPUT_EXT").toQString();
                pchBaseName += Option::dir_sep;

                ProString language = project->first(ProKey("QMAKE_LANGUAGE_" + compiler));
                if (!language.isEmpty()) {
                    pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT}"),
                                     escapeFilePath(pchBaseName + language + headerSuffix));
                    const ProStringList pchArchs = project->values("QMAKE_PCH_ARCHS");
                    for (const ProString &arch : pchArchs) {
                        QString file = pchBaseName + language + headerSuffix;
                        file.replace(QLatin1String("${QMAKE_PCH_ARCH}"), arch.toQString());
                        if (project->isActiveConfig("clang_pch_style")
                            && (file.endsWith(QLatin1String(".pch"))
                                || file.endsWith(QLatin1String(".gch")))) {
                            file.chop(4); // must omit header suffix for -include to recognize the PCH
                        }
                        pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT_") + arch + QLatin1Char('}'),
                                         escapeFilePath(file));
                    }
                }
            }

            if (!pchFlags.isEmpty())
                compile_flag += " " + pchFlags;
        }

        QString compilerExecutable;
        if (compiler == "C" || compiler == "OBJC") {
            compilerExecutable = "$(CC)";
            compile_flag += " $(CFLAGS)";
        } else {
            compilerExecutable = "$(CXX)";
            compile_flag += " $(CXXFLAGS)";
        }

        compile_flag += " $(INCPATH)";

        ProString compilerVariable = compiler;
        if (compilerVariable == "C")
            compilerVariable = ProString("CC");

        const ProKey runComp("QMAKE_RUN_" + compilerVariable);
        if(project->isEmpty(runComp))
            project->values(runComp).append(compilerExecutable + " " + compile_flag + " " + var("QMAKE_CC_O_FLAG") + "$obj $src");
        const ProKey runCompImp("QMAKE_RUN_" + compilerVariable + "_IMP");
        if(project->isEmpty(runCompImp))
            project->values(runCompImp).append(compilerExecutable + " " + compile_flag + " " + var("QMAKE_CC_O_FLAG") + "\"$@\" \"$<\"");
    }

    if (project->isActiveConfig("mac") && !project->isEmpty("TARGET") &&
       ((project->isActiveConfig("build_pass") || project->isEmpty("BUILDS")))) {
        ProString bundle;
        if(project->isActiveConfig("bundle") && !project->isEmpty("QMAKE_BUNDLE_EXTENSION")) {
            bundle = project->first("TARGET");
            if(!project->isEmpty("QMAKE_BUNDLE_NAME"))
                bundle = project->first("QMAKE_BUNDLE_NAME");
            if(!bundle.endsWith(project->first("QMAKE_BUNDLE_EXTENSION")))
                bundle += project->first("QMAKE_BUNDLE_EXTENSION");
        } else if(project->first("TEMPLATE") == "app" && project->isActiveConfig("app_bundle")) {
            bundle = project->first("TARGET");
            if(!project->isEmpty("QMAKE_APPLICATION_BUNDLE_NAME"))
                bundle = project->first("QMAKE_APPLICATION_BUNDLE_NAME");
            if(!bundle.endsWith(".app"))
                bundle += ".app";
            if(project->isEmpty("QMAKE_BUNDLE_LOCATION"))
                project->values("QMAKE_BUNDLE_LOCATION").append("Contents/MacOS");
            project->values("QMAKE_PKGINFO").append(project->first("DESTDIR") + bundle + "/Contents/PkgInfo");
        } else if(project->first("TEMPLATE") == "lib" && !project->isActiveConfig("staticlib") &&
                  ((!project->isActiveConfig("plugin") && project->isActiveConfig("lib_bundle")) ||
                   (project->isActiveConfig("plugin") && project->isActiveConfig("plugin_bundle")))) {
            bundle = project->first("TARGET");
            if(project->isActiveConfig("plugin")) {
                if(!project->isEmpty("QMAKE_PLUGIN_BUNDLE_NAME"))
                    bundle = project->first("QMAKE_PLUGIN_BUNDLE_NAME");
                if (project->isEmpty("QMAKE_BUNDLE_EXTENSION"))
                    project->values("QMAKE_BUNDLE_EXTENSION").append(".plugin");
                if (!bundle.endsWith(project->first("QMAKE_BUNDLE_EXTENSION")))
                    bundle += project->first("QMAKE_BUNDLE_EXTENSION");
                if(project->isEmpty("QMAKE_BUNDLE_LOCATION"))
                    project->values("QMAKE_BUNDLE_LOCATION").append("Contents/MacOS");
            } else {
                if(!project->isEmpty("QMAKE_FRAMEWORK_BUNDLE_NAME"))
                    bundle = project->first("QMAKE_FRAMEWORK_BUNDLE_NAME");
                if (project->isEmpty("QMAKE_BUNDLE_EXTENSION"))
                    project->values("QMAKE_BUNDLE_EXTENSION").append(".framework");
                if (!bundle.endsWith(project->first("QMAKE_BUNDLE_EXTENSION")))
                    bundle += project->first("QMAKE_BUNDLE_EXTENSION");
            }
        }
        if(!bundle.isEmpty()) {
            project->values("QMAKE_BUNDLE") = ProStringList(bundle);
        } else {
            project->values("QMAKE_BUNDLE").clear();
            project->values("QMAKE_BUNDLE_LOCATION").clear();
        }
    } else { //no bundling here
        project->values("QMAKE_BUNDLE").clear();
        project->values("QMAKE_BUNDLE_LOCATION").clear();
    }

    init2();
    ProString target = project->first("TARGET");
    int slsh = target.lastIndexOf(Option::dir_sep);
    if (slsh != -1)
        target.chopFront(slsh + 1);
    project->values("LIB_TARGET").prepend(target);
}